

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [32];
  Primitive PVar10;
  uint uVar11;
  int iVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  uint uVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [28];
  uint uVar92;
  uint uVar93;
  ulong uVar94;
  ulong uVar95;
  LinearSpace3fa *pLVar96;
  ulong uVar97;
  long lVar98;
  undefined4 uVar99;
  undefined8 uVar100;
  float fVar120;
  vint4 bi_2;
  undefined1 auVar106 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar119;
  float fVar121;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar105 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined8 uVar125;
  vint4 bi_1;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar129 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  float fVar147;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai_2;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  vint4 ai;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  vint4 ai_1;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined4 uVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  float fVar215;
  float fVar221;
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  float fVar230;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 auStack_7d0 [8];
  float fStack_7c8;
  undefined1 local_7b0 [16];
  LinearSpace3fa *local_798;
  Precalculations *local_790;
  Primitive *local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  RayQueryContext *local_698;
  undefined1 (*local_690) [16];
  RayHitK<4> *local_688;
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [2] [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint local_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar10 = prim[1];
  uVar97 = (ulong)(byte)PVar10;
  fVar148 = *(float *)(prim + uVar97 * 0x19 + 0x12);
  auVar165 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar165 = vinsertps_avx(auVar165,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar165 = vsubps_avx(auVar165,*(undefined1 (*) [16])(prim + uVar97 * 0x19 + 6));
  auVar101._0_4_ = fVar148 * auVar165._0_4_;
  auVar101._4_4_ = fVar148 * auVar165._4_4_;
  auVar101._8_4_ = fVar148 * auVar165._8_4_;
  auVar101._12_4_ = fVar148 * auVar165._12_4_;
  auVar178._0_4_ = fVar148 * auVar17._0_4_;
  auVar178._4_4_ = fVar148 * auVar17._4_4_;
  auVar178._8_4_ = fVar148 * auVar17._8_4_;
  auVar178._12_4_ = fVar148 * auVar17._12_4_;
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar97 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar94 = (ulong)(uint)((int)(uVar97 * 9) * 2);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar97 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar94 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar224._4_4_ = auVar178._0_4_;
  auVar224._0_4_ = auVar178._0_4_;
  auVar224._8_4_ = auVar178._0_4_;
  auVar224._12_4_ = auVar178._0_4_;
  auVar127 = vshufps_avx(auVar178,auVar178,0x55);
  auVar102 = vshufps_avx(auVar178,auVar178,0xaa);
  fVar148 = auVar102._0_4_;
  auVar212._0_4_ = fVar148 * auVar106._0_4_;
  fVar147 = auVar102._4_4_;
  auVar212._4_4_ = fVar147 * auVar106._4_4_;
  fVar119 = auVar102._8_4_;
  auVar212._8_4_ = fVar119 * auVar106._8_4_;
  fVar120 = auVar102._12_4_;
  auVar212._12_4_ = fVar120 * auVar106._12_4_;
  auVar206._0_4_ = auVar20._0_4_ * fVar148;
  auVar206._4_4_ = auVar20._4_4_ * fVar147;
  auVar206._8_4_ = auVar20._8_4_ * fVar119;
  auVar206._12_4_ = auVar20._12_4_ * fVar120;
  auVar194._0_4_ = auVar149._0_4_ * fVar148;
  auVar194._4_4_ = auVar149._4_4_ * fVar147;
  auVar194._8_4_ = auVar149._8_4_ * fVar119;
  auVar194._12_4_ = auVar149._12_4_ * fVar120;
  auVar102 = vfmadd231ps_fma(auVar212,auVar127,auVar17);
  auVar128 = vfmadd231ps_fma(auVar206,auVar127,auVar19);
  auVar127 = vfmadd231ps_fma(auVar194,auVar103,auVar127);
  auVar160 = vfmadd231ps_fma(auVar102,auVar224,auVar165);
  auVar128 = vfmadd231ps_fma(auVar128,auVar224,auVar18);
  auVar170 = vfmadd231ps_fma(auVar127,auVar104,auVar224);
  auVar225._4_4_ = auVar101._0_4_;
  auVar225._0_4_ = auVar101._0_4_;
  auVar225._8_4_ = auVar101._0_4_;
  auVar225._12_4_ = auVar101._0_4_;
  auVar127 = vshufps_avx(auVar101,auVar101,0x55);
  auVar102 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar148 = auVar102._0_4_;
  auVar179._0_4_ = fVar148 * auVar106._0_4_;
  fVar147 = auVar102._4_4_;
  auVar179._4_4_ = fVar147 * auVar106._4_4_;
  fVar119 = auVar102._8_4_;
  auVar179._8_4_ = fVar119 * auVar106._8_4_;
  fVar120 = auVar102._12_4_;
  auVar179._12_4_ = fVar120 * auVar106._12_4_;
  auVar126._0_4_ = auVar20._0_4_ * fVar148;
  auVar126._4_4_ = auVar20._4_4_ * fVar147;
  auVar126._8_4_ = auVar20._8_4_ * fVar119;
  auVar126._12_4_ = auVar20._12_4_ * fVar120;
  auVar102._0_4_ = auVar149._0_4_ * fVar148;
  auVar102._4_4_ = auVar149._4_4_ * fVar147;
  auVar102._8_4_ = auVar149._8_4_ * fVar119;
  auVar102._12_4_ = auVar149._12_4_ * fVar120;
  auVar17 = vfmadd231ps_fma(auVar179,auVar127,auVar17);
  auVar106 = vfmadd231ps_fma(auVar126,auVar127,auVar19);
  auVar19 = vfmadd231ps_fma(auVar102,auVar127,auVar103);
  auVar20 = vfmadd231ps_fma(auVar17,auVar225,auVar165);
  auVar103 = vfmadd231ps_fma(auVar106,auVar225,auVar18);
  auVar149 = vfmadd231ps_fma(auVar19,auVar225,auVar104);
  local_2d0._8_4_ = 0x7fffffff;
  local_2d0._0_8_ = 0x7fffffff7fffffff;
  local_2d0._12_4_ = 0x7fffffff;
  auVar165 = vandps_avx(auVar160,local_2d0);
  auVar169._8_4_ = 0x219392ef;
  auVar169._0_8_ = 0x219392ef219392ef;
  auVar169._12_4_ = 0x219392ef;
  auVar165 = vcmpps_avx(auVar165,auVar169,1);
  auVar17 = vblendvps_avx(auVar160,auVar169,auVar165);
  auVar165 = vandps_avx(auVar128,local_2d0);
  auVar165 = vcmpps_avx(auVar165,auVar169,1);
  auVar106 = vblendvps_avx(auVar128,auVar169,auVar165);
  auVar165 = vandps_avx(auVar170,local_2d0);
  auVar165 = vcmpps_avx(auVar165,auVar169,1);
  auVar165 = vblendvps_avx(auVar170,auVar169,auVar165);
  auVar18 = vrcpps_avx(auVar17);
  auVar191._8_4_ = 0x3f800000;
  auVar191._0_8_ = 0x3f8000003f800000;
  auVar191._12_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar17,auVar18,auVar191);
  auVar18 = vfmadd132ps_fma(auVar17,auVar18,auVar18);
  auVar17 = vrcpps_avx(auVar106);
  auVar106 = vfnmadd213ps_fma(auVar106,auVar17,auVar191);
  auVar19 = vfmadd132ps_fma(auVar106,auVar17,auVar17);
  auVar17 = vrcpps_avx(auVar165);
  auVar165 = vfnmadd213ps_fma(auVar165,auVar17,auVar191);
  auVar104 = vfmadd132ps_fma(auVar165,auVar17,auVar17);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar165 = vpmovsxwd_avx(auVar165);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar20);
  auVar170._0_4_ = auVar18._0_4_ * auVar165._0_4_;
  auVar170._4_4_ = auVar18._4_4_ * auVar165._4_4_;
  auVar170._8_4_ = auVar18._8_4_ * auVar165._8_4_;
  auVar170._12_4_ = auVar18._12_4_ * auVar165._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar165 = vpmovsxwd_avx(auVar17);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar20);
  auVar180._0_4_ = auVar18._0_4_ * auVar165._0_4_;
  auVar180._4_4_ = auVar18._4_4_ * auVar165._4_4_;
  auVar180._8_4_ = auVar18._8_4_ * auVar165._8_4_;
  auVar180._12_4_ = auVar18._12_4_ * auVar165._12_4_;
  auVar128._1_3_ = 0;
  auVar128[0] = PVar10;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar17 = vpmovsxwd_avx(auVar106);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar97 * -2 + 6);
  auVar165 = vpmovsxwd_avx(auVar18);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar103);
  auVar195._0_4_ = auVar165._0_4_ * auVar19._0_4_;
  auVar195._4_4_ = auVar165._4_4_ * auVar19._4_4_;
  auVar195._8_4_ = auVar165._8_4_ * auVar19._8_4_;
  auVar195._12_4_ = auVar165._12_4_ * auVar19._12_4_;
  auVar165 = vcvtdq2ps_avx(auVar17);
  auVar165 = vsubps_avx(auVar165,auVar103);
  auVar127._0_4_ = auVar19._0_4_ * auVar165._0_4_;
  auVar127._4_4_ = auVar19._4_4_ * auVar165._4_4_;
  auVar127._8_4_ = auVar19._8_4_ * auVar165._8_4_;
  auVar127._12_4_ = auVar19._12_4_ * auVar165._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar94 + uVar97 + 6);
  auVar165 = vpmovsxwd_avx(auVar19);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar149);
  auVar160._0_4_ = auVar104._0_4_ * auVar165._0_4_;
  auVar160._4_4_ = auVar104._4_4_ * auVar165._4_4_;
  auVar160._8_4_ = auVar104._8_4_ * auVar165._8_4_;
  auVar160._12_4_ = auVar104._12_4_ * auVar165._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar97 * 0x17 + 6);
  auVar165 = vpmovsxwd_avx(auVar20);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar149);
  auVar103._0_4_ = auVar104._0_4_ * auVar165._0_4_;
  auVar103._4_4_ = auVar104._4_4_ * auVar165._4_4_;
  auVar103._8_4_ = auVar104._8_4_ * auVar165._8_4_;
  auVar103._12_4_ = auVar104._12_4_ * auVar165._12_4_;
  auVar165 = vpminsd_avx(auVar170,auVar180);
  auVar17 = vpminsd_avx(auVar195,auVar127);
  auVar165 = vmaxps_avx(auVar165,auVar17);
  auVar17 = vpminsd_avx(auVar160,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar200._4_4_ = uVar99;
  auVar200._0_4_ = uVar99;
  auVar200._8_4_ = uVar99;
  auVar200._12_4_ = uVar99;
  auVar17 = vmaxps_avx(auVar17,auVar200);
  auVar165 = vmaxps_avx(auVar165,auVar17);
  local_2e0._0_4_ = auVar165._0_4_ * 0.99999964;
  local_2e0._4_4_ = auVar165._4_4_ * 0.99999964;
  local_2e0._8_4_ = auVar165._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar165._12_4_ * 0.99999964;
  auVar165 = vpmaxsd_avx(auVar170,auVar180);
  auVar17 = vpmaxsd_avx(auVar195,auVar127);
  auVar165 = vminps_avx(auVar165,auVar17);
  auVar17 = vpmaxsd_avx(auVar160,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar149._4_4_ = uVar99;
  auVar149._0_4_ = uVar99;
  auVar149._8_4_ = uVar99;
  auVar149._12_4_ = uVar99;
  auVar17 = vminps_avx(auVar17,auVar149);
  auVar165 = vminps_avx(auVar165,auVar17);
  auVar104._0_4_ = auVar165._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar165._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar165._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar165._12_4_ * 1.0000004;
  auVar128[4] = PVar10;
  auVar128._5_3_ = 0;
  auVar128[8] = PVar10;
  auVar128._9_3_ = 0;
  auVar128[0xc] = PVar10;
  auVar128._13_3_ = 0;
  auVar17 = vpcmpgtd_avx(auVar128,_DAT_01f7fcf0);
  auVar165 = vcmpps_avx(local_2e0,auVar104,2);
  auVar165 = vandps_avx(auVar165,auVar17);
  uVar92 = vmovmskps_avx(auVar165);
  if (uVar92 != 0) {
    uVar92 = uVar92 & 0xff;
    pLVar96 = pre->ray_space + k;
    local_5a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_5a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_5a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_5a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_690 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    local_798 = pLVar96;
    local_790 = pre;
    local_788 = prim;
    do {
      auVar141 = local_500;
      lVar23 = 0;
      uVar97 = (ulong)uVar92;
      for (uVar94 = uVar97; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar92 = *(uint *)(prim + 2);
      uVar11 = *(uint *)(prim + lVar23 * 4 + 6);
      pGVar14 = (context->scene->geometries).items[uVar92].ptr;
      uVar94 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar11);
      p_Var15 = pGVar14[1].intersectionFilterN;
      lVar23 = *(long *)&pGVar14[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar23 + (long)p_Var15 * uVar94);
      uVar79 = *(undefined8 *)*pauVar1;
      uVar80 = *(undefined8 *)(*pauVar1 + 8);
      auVar149 = *pauVar1;
      auVar20 = *pauVar1;
      auVar106 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar23 + (uVar94 + 1) * (long)p_Var15);
      uVar81 = *(undefined8 *)*pauVar2;
      uVar82 = *(undefined8 *)(*pauVar2 + 8);
      auVar103 = *pauVar2;
      auVar19 = *pauVar2;
      auVar17 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar23 + (uVar94 + 2) * (long)p_Var15);
      uVar83 = *(undefined8 *)*pauVar3;
      uVar84 = *(undefined8 *)(*pauVar3 + 8);
      auVar104 = *pauVar3;
      auVar18 = *pauVar3;
      auVar165 = *pauVar3;
      uVar97 = uVar97 - 1 & uVar97;
      pauVar4 = (undefined1 (*) [12])(lVar23 + (uVar94 + 3) * (long)p_Var15);
      uVar85 = *(undefined8 *)*pauVar4;
      uVar86 = *(undefined8 *)(*pauVar4 + 8);
      local_820 = (float)uVar85;
      fStack_81c = (float)((ulong)uVar85 >> 0x20);
      fStack_818 = (float)uVar86;
      fStack_814 = (float)((ulong)uVar86 >> 0x20);
      if (uVar97 != 0) {
        uVar95 = uVar97 - 1 & uVar97;
        for (uVar94 = uVar97; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
        }
        if (uVar95 != 0) {
          for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar12 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar127 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar160 = vinsertps_avx(auVar127,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar102 = vsubps_avx(*pauVar1,auVar160);
      uVar99 = auVar102._0_4_;
      auVar171._4_4_ = uVar99;
      auVar171._0_4_ = uVar99;
      auVar171._8_4_ = uVar99;
      auVar171._12_4_ = uVar99;
      auVar127 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
      aVar7 = (pLVar96->vx).field_0;
      aVar8 = (pLVar96->vy).field_0;
      fVar148 = (pLVar96->vz).field_0.m128[0];
      fVar147 = *(float *)((long)&(pLVar96->vz).field_0 + 4);
      fVar119 = *(float *)((long)&(pLVar96->vz).field_0 + 8);
      fVar120 = *(float *)((long)&(pLVar96->vz).field_0 + 0xc);
      auVar186._0_4_ = fVar148 * auVar102._0_4_;
      auVar186._4_4_ = fVar147 * auVar102._4_4_;
      auVar186._8_4_ = fVar119 * auVar102._8_4_;
      auVar186._12_4_ = fVar120 * auVar102._12_4_;
      auVar127 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar8,auVar127);
      auVar101 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar7,auVar171);
      auVar127 = vblendps_avx(auVar101,*pauVar1,8);
      auVar128 = vsubps_avx(*pauVar2,auVar160);
      uVar99 = auVar128._0_4_;
      auVar187._4_4_ = uVar99;
      auVar187._0_4_ = uVar99;
      auVar187._8_4_ = uVar99;
      auVar187._12_4_ = uVar99;
      auVar102 = vshufps_avx(auVar128,auVar128,0x55);
      auVar128 = vshufps_avx(auVar128,auVar128,0xaa);
      auVar207._0_4_ = fVar148 * auVar128._0_4_;
      auVar207._4_4_ = fVar147 * auVar128._4_4_;
      auVar207._8_4_ = fVar119 * auVar128._8_4_;
      auVar207._12_4_ = fVar120 * auVar128._12_4_;
      auVar102 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar8,auVar102);
      auVar126 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar7,auVar187);
      auVar102 = vblendps_avx(auVar126,*pauVar2,8);
      auVar170 = vsubps_avx(*pauVar3,auVar160);
      uVar99 = auVar170._0_4_;
      auVar192._4_4_ = uVar99;
      auVar192._0_4_ = uVar99;
      auVar192._8_4_ = uVar99;
      auVar192._12_4_ = uVar99;
      auVar128 = vshufps_avx(auVar170,auVar170,0x55);
      auVar170 = vshufps_avx(auVar170,auVar170,0xaa);
      auVar213._0_4_ = fVar148 * auVar170._0_4_;
      auVar213._4_4_ = fVar147 * auVar170._4_4_;
      auVar213._8_4_ = fVar119 * auVar170._8_4_;
      auVar213._12_4_ = fVar120 * auVar170._12_4_;
      auVar128 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar8,auVar128);
      auVar169 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar7,auVar192);
      auVar128 = vblendps_avx(auVar169,*pauVar3,8);
      auVar87._12_4_ = fStack_814;
      auVar87._0_12_ = *pauVar4;
      auVar170 = vsubps_avx(auVar87,auVar160);
      uVar99 = auVar170._0_4_;
      auVar193._4_4_ = uVar99;
      auVar193._0_4_ = uVar99;
      auVar193._8_4_ = uVar99;
      auVar193._12_4_ = uVar99;
      auVar160 = vshufps_avx(auVar170,auVar170,0x55);
      auVar170 = vshufps_avx(auVar170,auVar170,0xaa);
      auVar216._0_4_ = fVar148 * auVar170._0_4_;
      auVar216._4_4_ = fVar147 * auVar170._4_4_;
      auVar216._8_4_ = fVar119 * auVar170._8_4_;
      auVar216._12_4_ = fVar120 * auVar170._12_4_;
      auVar160 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar8,auVar160);
      auVar178 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar7,auVar193);
      auVar160 = vblendps_avx(auVar178,auVar87,8);
      auVar127 = vandps_avx(auVar127,local_2d0);
      auVar102 = vandps_avx(auVar102,local_2d0);
      auVar170 = vmaxps_avx(auVar127,auVar102);
      auVar127 = vandps_avx(auVar128,local_2d0);
      auVar102 = vandps_avx(auVar160,local_2d0);
      auVar127 = vmaxps_avx(auVar127,auVar102);
      auVar127 = vmaxps_avx(auVar170,auVar127);
      auVar102 = vmovshdup_avx(auVar127);
      auVar102 = vmaxss_avx(auVar102,auVar127);
      auVar127 = vshufpd_avx(auVar127,auVar127,1);
      auVar127 = vmaxss_avx(auVar127,auVar102);
      lVar23 = (long)iVar12 * 0x44;
      auVar102 = vmovshdup_avx(auVar101);
      uVar100 = auVar102._0_8_;
      local_4a0._8_8_ = uVar100;
      local_4a0._0_8_ = uVar100;
      local_4a0._16_8_ = uVar100;
      local_4a0._24_8_ = uVar100;
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x484);
      auVar102 = vmovshdup_avx(auVar126);
      uVar100 = auVar102._0_8_;
      local_4c0._8_8_ = uVar100;
      local_4c0._0_8_ = uVar100;
      local_4c0._16_8_ = uVar100;
      local_4c0._24_8_ = uVar100;
      auVar9 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x908);
      uVar211 = auVar169._0_4_;
      local_680._4_4_ = uVar211;
      local_680._0_4_ = uVar211;
      local_680._8_4_ = uVar211;
      local_680._12_4_ = uVar211;
      local_680._16_4_ = uVar211;
      local_680._20_4_ = uVar211;
      local_680._24_4_ = uVar211;
      local_680._28_4_ = uVar211;
      auVar102 = vmovshdup_avx(auVar169);
      uVar100 = auVar102._0_8_;
      local_5c0._8_8_ = uVar100;
      local_5c0._0_8_ = uVar100;
      local_5c0._16_8_ = uVar100;
      local_5c0._24_8_ = uVar100;
      fVar147 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      fVar119 = *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      fVar120 = *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      fVar121 = *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      fVar122 = *(float *)(catmullrom_basis0 + lVar23 + 0xd9c);
      fVar123 = *(float *)(catmullrom_basis0 + lVar23 + 0xda0);
      fVar124 = *(float *)(catmullrom_basis0 + lVar23 + 0xda4);
      auVar91 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      local_480 = auVar178._0_4_;
      auVar102 = vmovshdup_avx(auVar178);
      uVar100 = auVar102._0_8_;
      auVar185._0_4_ = fVar147 * local_480;
      auVar185._4_4_ = fVar119 * local_480;
      auVar185._8_4_ = fVar120 * local_480;
      auVar185._12_4_ = fVar121 * local_480;
      auVar185._16_4_ = fVar122 * local_480;
      auVar185._20_4_ = fVar123 * local_480;
      auVar185._24_4_ = fVar124 * local_480;
      auVar185._28_4_ = 0;
      local_660 = auVar102._0_4_;
      auVar107._0_4_ = local_660 * fVar147;
      fStack_65c = auVar102._4_4_;
      auVar107._4_4_ = fStack_65c * fVar119;
      auVar107._8_4_ = local_660 * fVar120;
      auVar107._12_4_ = fStack_65c * fVar121;
      auVar107._16_4_ = local_660 * fVar122;
      auVar107._20_4_ = fStack_65c * fVar123;
      auVar107._24_4_ = local_660 * fVar124;
      auVar107._28_4_ = 0;
      auVar102 = vfmadd231ps_fma(auVar185,auVar9,local_680);
      auVar128 = vfmadd231ps_fma(auVar107,auVar9,local_5c0);
      uVar99 = auVar126._0_4_;
      local_760._4_4_ = uVar99;
      local_760._0_4_ = uVar99;
      local_760._8_4_ = uVar99;
      local_760._12_4_ = uVar99;
      local_760._16_4_ = uVar99;
      local_760._20_4_ = uVar99;
      local_760._24_4_ = uVar99;
      local_760._28_4_ = uVar99;
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar115,local_760);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar115,local_4c0);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23);
      uVar99 = auVar101._0_4_;
      local_780._4_4_ = uVar99;
      local_780._0_4_ = uVar99;
      local_780._8_4_ = uVar99;
      local_780._12_4_ = uVar99;
      local_780._16_4_ = uVar99;
      local_780._20_4_ = uVar99;
      local_780._24_4_ = uVar99;
      local_780._28_4_ = uVar99;
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar107,local_780);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar107,local_4a0);
      auVar185 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x908);
      fVar72 = *(float *)(catmullrom_basis1 + lVar23 + 0xd8c);
      fVar73 = *(float *)(catmullrom_basis1 + lVar23 + 0xd90);
      fVar74 = *(float *)(catmullrom_basis1 + lVar23 + 0xd94);
      fVar75 = *(float *)(catmullrom_basis1 + lVar23 + 0xd98);
      fVar76 = *(float *)(catmullrom_basis1 + lVar23 + 0xd9c);
      fVar77 = *(float *)(catmullrom_basis1 + lVar23 + 0xda0);
      fVar78 = *(float *)(catmullrom_basis1 + lVar23 + 0xda4);
      auVar114._4_4_ = fVar73 * local_480;
      auVar114._0_4_ = fVar72 * local_480;
      auVar114._8_4_ = fVar74 * local_480;
      auVar114._12_4_ = fVar75 * local_480;
      auVar114._16_4_ = fVar76 * local_480;
      auVar114._20_4_ = fVar77 * local_480;
      auVar114._24_4_ = fVar78 * local_480;
      auVar114._28_4_ = local_480;
      auVar160 = vfmadd231ps_fma(auVar114,auVar185,local_680);
      auVar138._4_4_ = fStack_65c * fVar73;
      auVar138._0_4_ = local_660 * fVar72;
      auVar138._8_4_ = local_660 * fVar74;
      auVar138._12_4_ = fStack_65c * fVar75;
      auVar138._16_4_ = local_660 * fVar76;
      auVar138._20_4_ = fStack_65c * fVar77;
      auVar138._24_4_ = local_660 * fVar78;
      auVar138._28_4_ = uVar211;
      auVar170 = vfmadd231ps_fma(auVar138,auVar185,local_5c0);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x484);
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar114,local_760);
      auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar114,local_4c0);
      auVar138 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23);
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar138,local_780);
      auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar138,local_4a0);
      auVar133 = ZEXT1632(auVar160);
      local_320 = ZEXT1632(auVar102);
      auVar118 = vsubps_avx(auVar133,local_320);
      auVar156 = ZEXT1632(auVar170);
      auVar108 = ZEXT1632(auVar128);
      local_340 = vsubps_avx(auVar156,auVar108);
      auVar109._0_4_ = auVar128._0_4_ * auVar118._0_4_;
      auVar109._4_4_ = auVar128._4_4_ * auVar118._4_4_;
      auVar109._8_4_ = auVar128._8_4_ * auVar118._8_4_;
      auVar109._12_4_ = auVar128._12_4_ * auVar118._12_4_;
      auVar109._16_4_ = auVar118._16_4_ * 0.0;
      auVar109._20_4_ = auVar118._20_4_ * 0.0;
      auVar109._24_4_ = auVar118._24_4_ * 0.0;
      auVar109._28_4_ = 0;
      fVar215 = local_340._0_4_;
      auVar134._0_4_ = fVar215 * auVar102._0_4_;
      fVar221 = local_340._4_4_;
      auVar134._4_4_ = fVar221 * auVar102._4_4_;
      fVar230 = local_340._8_4_;
      auVar134._8_4_ = fVar230 * auVar102._8_4_;
      fVar231 = local_340._12_4_;
      auVar134._12_4_ = fVar231 * auVar102._12_4_;
      fVar232 = local_340._16_4_;
      auVar134._16_4_ = fVar232 * 0.0;
      fVar233 = local_340._20_4_;
      auVar134._20_4_ = fVar233 * 0.0;
      fVar234 = local_340._24_4_;
      auVar134._24_4_ = fVar234 * 0.0;
      auVar134._28_4_ = 0;
      auVar109 = vsubps_avx(auVar109,auVar134);
      auVar102 = vpermilps_avx(*pauVar1,0xff);
      uVar125 = auVar102._0_8_;
      local_80._8_8_ = uVar125;
      local_80._0_8_ = uVar125;
      local_80._16_8_ = uVar125;
      local_80._24_8_ = uVar125;
      auVar128 = vpermilps_avx(*pauVar2,0xff);
      uVar125 = auVar128._0_8_;
      local_a0._8_8_ = uVar125;
      local_a0._0_8_ = uVar125;
      local_a0._16_8_ = uVar125;
      local_a0._24_8_ = uVar125;
      auVar128 = vpermilps_avx(*pauVar3,0xff);
      uVar125 = auVar128._0_8_;
      local_c0._8_8_ = uVar125;
      local_c0._0_8_ = uVar125;
      local_c0._16_8_ = uVar125;
      local_c0._24_8_ = uVar125;
      auVar88._12_4_ = fStack_814;
      auVar88._0_12_ = *pauVar4;
      auVar128 = vpermilps_avx(auVar88,0xff);
      local_e0 = auVar128._0_8_;
      fVar148 = auVar128._0_4_;
      auVar188._0_4_ = fVar147 * fVar148;
      fVar147 = auVar128._4_4_;
      auVar188._4_4_ = fVar119 * fVar147;
      auVar188._8_4_ = fVar120 * fVar148;
      auVar188._12_4_ = fVar121 * fVar147;
      auVar188._16_4_ = fVar122 * fVar148;
      auVar188._20_4_ = fVar123 * fVar147;
      auVar188._24_4_ = fVar124 * fVar148;
      auVar188._28_4_ = 0;
      auVar128 = vfmadd231ps_fma(auVar188,local_c0,auVar9);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),local_a0,auVar115);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar107,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar205._4_4_ = fVar73 * fVar147;
      auVar205._0_4_ = fVar72 * fVar148;
      auVar205._8_4_ = fVar74 * fVar148;
      auVar205._12_4_ = fVar75 * fVar147;
      auVar205._16_4_ = fVar76 * fVar148;
      auVar205._20_4_ = fVar77 * fVar147;
      auVar205._24_4_ = fVar78 * fVar148;
      auVar205._28_4_ = auVar107._28_4_;
      auVar160 = vfmadd231ps_fma(auVar205,auVar185,local_c0);
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar114,local_a0);
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar138,local_80);
      auVar116._4_4_ = fVar221 * fVar221;
      auVar116._0_4_ = fVar215 * fVar215;
      auVar116._8_4_ = fVar230 * fVar230;
      auVar116._12_4_ = fVar231 * fVar231;
      auVar116._16_4_ = fVar232 * fVar232;
      auVar116._20_4_ = fVar233 * fVar233;
      auVar116._24_4_ = fVar234 * fVar234;
      auVar116._28_4_ = auVar102._4_4_;
      auVar102 = vfmadd231ps_fma(auVar116,auVar118,auVar118);
      auVar205 = vmaxps_avx(ZEXT1632(auVar128),ZEXT1632(auVar160));
      auVar16._4_4_ = auVar205._4_4_ * auVar205._4_4_ * auVar102._4_4_;
      auVar16._0_4_ = auVar205._0_4_ * auVar205._0_4_ * auVar102._0_4_;
      auVar16._8_4_ = auVar205._8_4_ * auVar205._8_4_ * auVar102._8_4_;
      auVar16._12_4_ = auVar205._12_4_ * auVar205._12_4_ * auVar102._12_4_;
      auVar16._16_4_ = auVar205._16_4_ * auVar205._16_4_ * 0.0;
      auVar16._20_4_ = auVar205._20_4_ * auVar205._20_4_ * 0.0;
      auVar16._24_4_ = auVar205._24_4_ * auVar205._24_4_ * 0.0;
      auVar16._28_4_ = auVar205._28_4_;
      auVar21._4_4_ = auVar109._4_4_ * auVar109._4_4_;
      auVar21._0_4_ = auVar109._0_4_ * auVar109._0_4_;
      auVar21._8_4_ = auVar109._8_4_ * auVar109._8_4_;
      auVar21._12_4_ = auVar109._12_4_ * auVar109._12_4_;
      auVar21._16_4_ = auVar109._16_4_ * auVar109._16_4_;
      auVar21._20_4_ = auVar109._20_4_ * auVar109._20_4_;
      auVar21._24_4_ = auVar109._24_4_ * auVar109._24_4_;
      auVar21._28_4_ = auVar109._28_4_;
      auVar205 = vcmpps_avx(auVar21,auVar16,2);
      fVar148 = auVar127._0_4_ * 4.7683716e-07;
      auVar110._0_4_ = (float)iVar12;
      local_500._4_12_ = auVar169._4_12_;
      local_500._0_4_ = auVar110._0_4_;
      local_500._16_16_ = auVar141._16_16_;
      auVar110._4_4_ = auVar110._0_4_;
      auVar110._8_4_ = auVar110._0_4_;
      auVar110._12_4_ = auVar110._0_4_;
      auVar110._16_4_ = auVar110._0_4_;
      auVar110._20_4_ = auVar110._0_4_;
      auVar110._24_4_ = auVar110._0_4_;
      auVar110._28_4_ = auVar110._0_4_;
      auVar141 = vcmpps_avx(_DAT_01faff40,auVar110,1);
      auVar127 = vpermilps_avx(auVar101,0xaa);
      uVar125 = auVar127._0_8_;
      local_560._8_8_ = uVar125;
      local_560._0_8_ = uVar125;
      local_560._16_8_ = uVar125;
      local_560._24_8_ = uVar125;
      auVar127 = vpermilps_avx(auVar126,0xaa);
      uVar125 = auVar127._0_8_;
      auVar226._8_8_ = uVar125;
      auVar226._0_8_ = uVar125;
      auVar226._16_8_ = uVar125;
      auVar226._24_8_ = uVar125;
      auVar127 = vshufps_avx(auVar169,auVar169,0xaa);
      uVar125 = auVar127._0_8_;
      auVar214._8_8_ = uVar125;
      auVar214._0_8_ = uVar125;
      auVar214._16_8_ = uVar125;
      auVar214._24_8_ = uVar125;
      auVar127 = vshufps_avx(auVar178,auVar178,0xaa);
      uVar125 = auVar127._0_8_;
      register0x00001508 = uVar125;
      local_640 = uVar125;
      register0x00001510 = uVar125;
      register0x00001518 = uVar125;
      auVar219 = ZEXT3264(_local_640);
      auVar109 = auVar141 & auVar205;
      uVar99 = *(undefined4 *)(ray + k * 4 + 0x30);
      fStack_658 = local_660;
      fStack_654 = fStack_65c;
      fStack_650 = local_660;
      fStack_64c = fStack_65c;
      fStack_648 = local_660;
      fStack_644 = fStack_65c;
      fStack_47c = local_480;
      fStack_478 = local_480;
      fStack_474 = local_480;
      fStack_470 = local_480;
      fStack_46c = local_480;
      fStack_468 = local_480;
      fStack_464 = local_480;
      if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar109 >> 0x7f,0) == '\0') &&
            (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar109 >> 0xbf,0) == '\0') &&
          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar109[0x1f]) {
        auVar146 = ZEXT3264(local_680);
        auVar168 = ZEXT3264(local_5c0);
        auVar199 = ZEXT3264(CONCAT428(fStack_65c,
                                      CONCAT424(local_660,
                                                CONCAT420(fStack_65c,
                                                          CONCAT416(local_660,
                                                                    CONCAT412(fStack_65c,
                                                                              CONCAT48(local_660,
                                                                                       uVar100))))))
                           );
        auVar223 = ZEXT3264(local_760);
        auVar229 = ZEXT3264(local_780);
      }
      else {
        local_360 = vandps_avx(auVar205,auVar141);
        fVar215 = auVar127._0_4_;
        fVar221 = auVar127._4_4_;
        auVar141._4_4_ = fVar221 * fVar73;
        auVar141._0_4_ = fVar215 * fVar72;
        auVar141._8_4_ = fVar215 * fVar74;
        auVar141._12_4_ = fVar221 * fVar75;
        auVar141._16_4_ = fVar215 * fVar76;
        auVar141._20_4_ = fVar221 * fVar77;
        auVar141._24_4_ = fVar215 * fVar78;
        auVar141._28_4_ = local_360._28_4_;
        auVar127 = vfmadd213ps_fma(auVar185,auVar214,auVar141);
        auVar127 = vfmadd213ps_fma(auVar114,auVar226,ZEXT1632(auVar127));
        auVar127 = vfmadd213ps_fma(auVar138,local_560,ZEXT1632(auVar127));
        local_380 = ZEXT1632(auVar127);
        local_4e0._0_4_ = auVar91._0_4_;
        local_4e0._4_4_ = auVar91._4_4_;
        fStack_4d8 = auVar91._8_4_;
        fStack_4d4 = auVar91._12_4_;
        fStack_4d0 = auVar91._16_4_;
        fStack_4cc = auVar91._20_4_;
        fStack_4c8 = auVar91._24_4_;
        auVar24._4_4_ = fVar221 * (float)local_4e0._4_4_;
        auVar24._0_4_ = fVar215 * (float)local_4e0._0_4_;
        auVar24._8_4_ = fVar215 * fStack_4d8;
        auVar24._12_4_ = fVar221 * fStack_4d4;
        auVar24._16_4_ = fVar215 * fStack_4d0;
        auVar24._20_4_ = fVar221 * fStack_4cc;
        auVar24._24_4_ = fVar215 * fStack_4c8;
        auVar24._28_4_ = local_360._28_4_;
        auVar127 = vfmadd213ps_fma(auVar9,auVar214,auVar24);
        auVar127 = vfmadd213ps_fma(auVar115,auVar226,ZEXT1632(auVar127));
        auVar141 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1694);
        auVar9 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1b18);
        fVar147 = *(float *)(catmullrom_basis0 + lVar23 + 0x1f9c);
        fVar119 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa0);
        fVar120 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa4);
        fVar121 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa8);
        fVar122 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fac);
        fVar123 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb0);
        fVar124 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb4);
        auVar181._0_4_ = local_480 * fVar147;
        auVar181._4_4_ = local_480 * fVar119;
        auVar181._8_4_ = local_480 * fVar120;
        auVar181._12_4_ = local_480 * fVar121;
        auVar181._16_4_ = local_480 * fVar122;
        auVar181._20_4_ = local_480 * fVar123;
        auVar181._24_4_ = local_480 * fVar124;
        auVar181._28_4_ = 0;
        auVar196._0_4_ = local_660 * fVar147;
        auVar196._4_4_ = fStack_65c * fVar119;
        auVar196._8_4_ = local_660 * fVar120;
        auVar196._12_4_ = fStack_65c * fVar121;
        auVar196._16_4_ = local_660 * fVar122;
        auVar196._20_4_ = fStack_65c * fVar123;
        auVar196._24_4_ = local_660 * fVar124;
        auVar196._28_4_ = 0;
        auVar208._0_4_ = fVar215 * fVar147;
        auVar208._4_4_ = fVar221 * fVar119;
        auVar208._8_4_ = fVar215 * fVar120;
        auVar208._12_4_ = fVar221 * fVar121;
        auVar208._16_4_ = fVar215 * fVar122;
        auVar208._20_4_ = fVar221 * fVar123;
        auVar208._24_4_ = fVar215 * fVar124;
        auVar208._28_4_ = 0;
        auVar102 = vfmadd231ps_fma(auVar181,auVar9,local_680);
        auVar170 = vfmadd231ps_fma(auVar196,auVar9,local_5c0);
        auVar101 = vfmadd231ps_fma(auVar208,auVar214,auVar9);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar115,local_760);
        auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar115,local_4c0);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar226,auVar115);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar141,local_780);
        auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar141,local_4a0);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar141,local_560);
        fVar147 = *(float *)(catmullrom_basis1 + lVar23 + 0x1f9c);
        fVar119 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa0);
        fVar120 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa4);
        fVar121 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa8);
        fVar122 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fac);
        fVar123 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb0);
        fVar124 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb4);
        auVar115._4_4_ = local_480 * fVar119;
        auVar115._0_4_ = local_480 * fVar147;
        auVar115._8_4_ = local_480 * fVar120;
        auVar115._12_4_ = local_480 * fVar121;
        auVar115._16_4_ = local_480 * fVar122;
        auVar115._20_4_ = local_480 * fVar123;
        auVar115._24_4_ = local_480 * fVar124;
        auVar115._28_4_ = local_480;
        auVar9._4_4_ = fStack_65c * fVar119;
        auVar9._0_4_ = local_660 * fVar147;
        auVar9._8_4_ = local_660 * fVar120;
        auVar9._12_4_ = fStack_65c * fVar121;
        auVar9._16_4_ = local_660 * fVar122;
        auVar9._20_4_ = fStack_65c * fVar123;
        auVar9._24_4_ = local_660 * fVar124;
        auVar9._28_4_ = fStack_65c;
        auVar25._4_4_ = fVar221 * fVar119;
        auVar25._0_4_ = fVar215 * fVar147;
        auVar25._8_4_ = fVar215 * fVar120;
        auVar25._12_4_ = fVar221 * fVar121;
        auVar25._16_4_ = fVar215 * fVar122;
        auVar25._20_4_ = fVar221 * fVar123;
        auVar25._24_4_ = fVar215 * fVar124;
        auVar25._28_4_ = fVar221;
        auVar141 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1b18);
        auVar126 = vfmadd231ps_fma(auVar115,auVar141,local_680);
        auVar169 = vfmadd231ps_fma(auVar9,auVar141,local_5c0);
        auVar178 = vfmadd231ps_fma(auVar25,auVar214,auVar141);
        auVar141 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1694);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar141,local_760);
        auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar141,local_4c0);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar141,auVar226);
        auVar141 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1210);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar141,local_780);
        auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar141,local_4a0);
        auVar135._8_4_ = 0x7fffffff;
        auVar135._0_8_ = 0x7fffffff7fffffff;
        auVar135._12_4_ = 0x7fffffff;
        auVar135._16_4_ = 0x7fffffff;
        auVar135._20_4_ = 0x7fffffff;
        auVar135._24_4_ = 0x7fffffff;
        auVar135._28_4_ = 0x7fffffff;
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),local_560,auVar141);
        auVar141 = vandps_avx(ZEXT1632(auVar102),auVar135);
        auVar115 = vandps_avx(ZEXT1632(auVar170),auVar135);
        auVar115 = vmaxps_avx(auVar141,auVar115);
        auVar141 = vandps_avx(ZEXT1632(auVar101),auVar135);
        auVar141 = vmaxps_avx(auVar115,auVar141);
        auVar157._4_4_ = fVar148;
        auVar157._0_4_ = fVar148;
        auVar157._8_4_ = fVar148;
        auVar157._12_4_ = fVar148;
        auVar157._16_4_ = fVar148;
        auVar157._20_4_ = fVar148;
        auVar157._24_4_ = fVar148;
        auVar157._28_4_ = fVar148;
        auVar141 = vcmpps_avx(auVar141,auVar157,1);
        auVar9 = vblendvps_avx(ZEXT1632(auVar102),auVar118,auVar141);
        auVar185 = vblendvps_avx(ZEXT1632(auVar170),local_340,auVar141);
        auVar141 = vandps_avx(ZEXT1632(auVar126),auVar135);
        auVar115 = vandps_avx(ZEXT1632(auVar169),auVar135);
        auVar114 = vmaxps_avx(auVar141,auVar115);
        auVar141 = vandps_avx(ZEXT1632(auVar178),auVar135);
        auVar141 = vmaxps_avx(auVar114,auVar141);
        auVar138 = vcmpps_avx(auVar141,auVar157,1);
        auVar141 = vblendvps_avx(ZEXT1632(auVar126),auVar118,auVar138);
        auVar114 = vblendvps_avx(ZEXT1632(auVar169),local_340,auVar138);
        auVar127 = vfmadd213ps_fma(auVar107,local_560,ZEXT1632(auVar127));
        auVar102 = vfmadd213ps_fma(auVar9,auVar9,ZEXT832(0) << 0x20);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar185,auVar185);
        auVar107 = vrsqrtps_avx(ZEXT1632(auVar102));
        fVar147 = auVar107._0_4_;
        fVar119 = auVar107._4_4_;
        fVar120 = auVar107._8_4_;
        fVar121 = auVar107._12_4_;
        fVar122 = auVar107._16_4_;
        fVar123 = auVar107._20_4_;
        fVar124 = auVar107._24_4_;
        auVar26._4_4_ = fVar119 * fVar119 * fVar119 * auVar102._4_4_ * -0.5;
        auVar26._0_4_ = fVar147 * fVar147 * fVar147 * auVar102._0_4_ * -0.5;
        auVar26._8_4_ = fVar120 * fVar120 * fVar120 * auVar102._8_4_ * -0.5;
        auVar26._12_4_ = fVar121 * fVar121 * fVar121 * auVar102._12_4_ * -0.5;
        auVar26._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar26._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar26._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar26._28_4_ = auVar115._28_4_;
        auVar227._8_4_ = 0x3fc00000;
        auVar227._0_8_ = 0x3fc000003fc00000;
        auVar227._12_4_ = 0x3fc00000;
        auVar227._16_4_ = 0x3fc00000;
        auVar227._20_4_ = 0x3fc00000;
        auVar227._24_4_ = 0x3fc00000;
        auVar227._28_4_ = 0x3fc00000;
        auVar102 = vfmadd231ps_fma(auVar26,auVar227,auVar107);
        fVar147 = auVar102._0_4_;
        fVar119 = auVar102._4_4_;
        auVar27._4_4_ = fVar119 * auVar185._4_4_;
        auVar27._0_4_ = fVar147 * auVar185._0_4_;
        fVar120 = auVar102._8_4_;
        auVar27._8_4_ = fVar120 * auVar185._8_4_;
        fVar121 = auVar102._12_4_;
        auVar27._12_4_ = fVar121 * auVar185._12_4_;
        auVar27._16_4_ = auVar185._16_4_ * 0.0;
        auVar27._20_4_ = auVar185._20_4_ * 0.0;
        auVar27._24_4_ = auVar185._24_4_ * 0.0;
        auVar27._28_4_ = 0;
        auVar28._4_4_ = fVar119 * -auVar9._4_4_;
        auVar28._0_4_ = fVar147 * -auVar9._0_4_;
        auVar28._8_4_ = fVar120 * -auVar9._8_4_;
        auVar28._12_4_ = fVar121 * -auVar9._12_4_;
        auVar28._16_4_ = -auVar9._16_4_ * 0.0;
        auVar28._20_4_ = -auVar9._20_4_ * 0.0;
        auVar28._24_4_ = -auVar9._24_4_ * 0.0;
        auVar28._28_4_ = auVar107._28_4_;
        auVar102 = vfmadd213ps_fma(auVar141,auVar141,ZEXT832(0) << 0x20);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar114,auVar114);
        auVar115 = vrsqrtps_avx(ZEXT1632(auVar102));
        auVar29._28_4_ = auVar138._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar121 * 0.0,
                                CONCAT48(fVar120 * 0.0,CONCAT44(fVar119 * 0.0,fVar147 * 0.0))));
        fVar147 = auVar115._0_4_;
        fVar119 = auVar115._4_4_;
        fVar120 = auVar115._8_4_;
        fVar121 = auVar115._12_4_;
        fVar122 = auVar115._16_4_;
        fVar123 = auVar115._20_4_;
        fVar124 = auVar115._24_4_;
        auVar30._4_4_ = fVar119 * fVar119 * fVar119 * auVar102._4_4_ * -0.5;
        auVar30._0_4_ = fVar147 * fVar147 * fVar147 * auVar102._0_4_ * -0.5;
        auVar30._8_4_ = fVar120 * fVar120 * fVar120 * auVar102._8_4_ * -0.5;
        auVar30._12_4_ = fVar121 * fVar121 * fVar121 * auVar102._12_4_ * -0.5;
        auVar30._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar30._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar30._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar30._28_4_ = 0;
        auVar102 = vfmadd231ps_fma(auVar30,auVar227,auVar115);
        fVar147 = auVar102._0_4_;
        auVar209._0_4_ = auVar114._0_4_ * fVar147;
        fVar119 = auVar102._4_4_;
        auVar209._4_4_ = auVar114._4_4_ * fVar119;
        fVar120 = auVar102._8_4_;
        auVar209._8_4_ = auVar114._8_4_ * fVar120;
        fVar121 = auVar102._12_4_;
        auVar209._12_4_ = auVar114._12_4_ * fVar121;
        auVar209._16_4_ = auVar114._16_4_ * 0.0;
        auVar209._20_4_ = auVar114._20_4_ * 0.0;
        auVar209._24_4_ = auVar114._24_4_ * 0.0;
        auVar209._28_4_ = 0;
        auVar31._4_4_ = -auVar141._4_4_ * fVar119;
        auVar31._0_4_ = -auVar141._0_4_ * fVar147;
        auVar31._8_4_ = -auVar141._8_4_ * fVar120;
        auVar31._12_4_ = -auVar141._12_4_ * fVar121;
        auVar31._16_4_ = -auVar141._16_4_ * 0.0;
        auVar31._20_4_ = -auVar141._20_4_ * 0.0;
        auVar31._24_4_ = -auVar141._24_4_ * 0.0;
        auVar31._28_4_ = auVar114._28_4_;
        auVar32._28_4_ = auVar115._28_4_;
        auVar32._0_28_ =
             ZEXT1628(CONCAT412(fVar121 * 0.0,
                                CONCAT48(fVar120 * 0.0,CONCAT44(fVar119 * 0.0,fVar147 * 0.0))));
        auVar102 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar128),local_320);
        auVar141 = ZEXT1632(auVar128);
        auVar170 = vfmadd213ps_fma(auVar28,auVar141,auVar108);
        auVar101 = vfmadd213ps_fma(auVar29,auVar141,ZEXT1632(auVar127));
        auVar179 = vfnmadd213ps_fma(auVar27,auVar141,local_320);
        auVar126 = vfmadd213ps_fma(auVar209,ZEXT1632(auVar160),auVar133);
        auVar180 = vfnmadd213ps_fma(auVar28,auVar141,auVar108);
        auVar141 = ZEXT1632(auVar160);
        auVar169 = vfmadd213ps_fma(auVar31,auVar141,auVar156);
        auVar188 = ZEXT1632(auVar128);
        auVar195 = vfnmadd231ps_fma(ZEXT1632(auVar127),auVar188,auVar29);
        auVar128 = vfmadd213ps_fma(auVar32,auVar141,local_380);
        auVar191 = vfnmadd213ps_fma(auVar209,auVar141,auVar133);
        auVar194 = vfnmadd213ps_fma(auVar31,auVar141,auVar156);
        auVar200 = vfnmadd231ps_fma(local_380,ZEXT1632(auVar160),auVar32);
        auVar141 = vsubps_avx(ZEXT1632(auVar169),ZEXT1632(auVar180));
        auVar115 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar195));
        auVar108._4_4_ = auVar195._4_4_ * auVar141._4_4_;
        auVar108._0_4_ = auVar195._0_4_ * auVar141._0_4_;
        auVar108._8_4_ = auVar195._8_4_ * auVar141._8_4_;
        auVar108._12_4_ = auVar195._12_4_ * auVar141._12_4_;
        auVar108._16_4_ = auVar141._16_4_ * 0.0;
        auVar108._20_4_ = auVar141._20_4_ * 0.0;
        auVar108._24_4_ = auVar141._24_4_ * 0.0;
        auVar108._28_4_ = 0;
        auVar178 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar180),auVar115);
        auVar133._4_4_ = auVar115._4_4_ * auVar179._4_4_;
        auVar133._0_4_ = auVar115._0_4_ * auVar179._0_4_;
        auVar133._8_4_ = auVar115._8_4_ * auVar179._8_4_;
        auVar133._12_4_ = auVar115._12_4_ * auVar179._12_4_;
        auVar133._16_4_ = auVar115._16_4_ * 0.0;
        auVar133._20_4_ = auVar115._20_4_ * 0.0;
        auVar133._24_4_ = auVar115._24_4_ * 0.0;
        auVar133._28_4_ = auVar115._28_4_;
        auVar115 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar179));
        auVar127 = vfmsub231ps_fma(auVar133,ZEXT1632(auVar195),auVar115);
        auVar156._4_4_ = auVar180._4_4_ * auVar115._4_4_;
        auVar156._0_4_ = auVar180._0_4_ * auVar115._0_4_;
        auVar156._8_4_ = auVar180._8_4_ * auVar115._8_4_;
        auVar156._12_4_ = auVar180._12_4_ * auVar115._12_4_;
        auVar156._16_4_ = auVar115._16_4_ * 0.0;
        auVar156._20_4_ = auVar115._20_4_ * 0.0;
        auVar156._24_4_ = auVar115._24_4_ * 0.0;
        auVar156._28_4_ = auVar115._28_4_;
        auVar138 = ZEXT1632(auVar179);
        auVar179 = vfmsub231ps_fma(auVar156,auVar138,auVar141);
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT832(0) << 0x20,ZEXT1632(auVar127));
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),ZEXT832(0) << 0x20,ZEXT1632(auVar178));
        auVar116 = vcmpps_avx(ZEXT1632(auVar127),ZEXT832(0) << 0x20,2);
        auVar141 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar102),auVar116);
        auVar115 = vblendvps_avx(ZEXT1632(auVar194),ZEXT1632(auVar170),auVar116);
        auVar9 = vblendvps_avx(ZEXT1632(auVar200),ZEXT1632(auVar101),auVar116);
        auVar107 = vblendvps_avx(auVar138,ZEXT1632(auVar126),auVar116);
        auVar185 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar169),auVar116);
        auVar114 = vblendvps_avx(ZEXT1632(auVar195),ZEXT1632(auVar128),auVar116);
        auVar138 = vblendvps_avx(ZEXT1632(auVar126),auVar138,auVar116);
        auVar205 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar180),auVar116);
        auVar127 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar109 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar195),auVar116);
        auVar16 = vsubps_avx(auVar138,auVar141);
        auVar21 = vsubps_avx(auVar205,auVar115);
        auVar108 = vsubps_avx(auVar109,auVar9);
        auVar133 = vsubps_avx(auVar141,auVar107);
        auVar134 = vsubps_avx(auVar115,auVar185);
        auVar156 = vsubps_avx(auVar9,auVar114);
        auVar33._4_4_ = auVar108._4_4_ * auVar141._4_4_;
        auVar33._0_4_ = auVar108._0_4_ * auVar141._0_4_;
        auVar33._8_4_ = auVar108._8_4_ * auVar141._8_4_;
        auVar33._12_4_ = auVar108._12_4_ * auVar141._12_4_;
        auVar33._16_4_ = auVar108._16_4_ * auVar141._16_4_;
        auVar33._20_4_ = auVar108._20_4_ * auVar141._20_4_;
        auVar33._24_4_ = auVar108._24_4_ * auVar141._24_4_;
        auVar33._28_4_ = auVar109._28_4_;
        auVar102 = vfmsub231ps_fma(auVar33,auVar9,auVar16);
        auVar34._4_4_ = auVar16._4_4_ * auVar115._4_4_;
        auVar34._0_4_ = auVar16._0_4_ * auVar115._0_4_;
        auVar34._8_4_ = auVar16._8_4_ * auVar115._8_4_;
        auVar34._12_4_ = auVar16._12_4_ * auVar115._12_4_;
        auVar34._16_4_ = auVar16._16_4_ * auVar115._16_4_;
        auVar34._20_4_ = auVar16._20_4_ * auVar115._20_4_;
        auVar34._24_4_ = auVar16._24_4_ * auVar115._24_4_;
        auVar34._28_4_ = auVar138._28_4_;
        auVar128 = vfmsub231ps_fma(auVar34,auVar141,auVar21);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar128),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
        auVar111._0_4_ = auVar21._0_4_ * auVar9._0_4_;
        auVar111._4_4_ = auVar21._4_4_ * auVar9._4_4_;
        auVar111._8_4_ = auVar21._8_4_ * auVar9._8_4_;
        auVar111._12_4_ = auVar21._12_4_ * auVar9._12_4_;
        auVar111._16_4_ = auVar21._16_4_ * auVar9._16_4_;
        auVar111._20_4_ = auVar21._20_4_ * auVar9._20_4_;
        auVar111._24_4_ = auVar21._24_4_ * auVar9._24_4_;
        auVar111._28_4_ = 0;
        auVar128 = vfmsub231ps_fma(auVar111,auVar115,auVar108);
        auVar128 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar128));
        auVar112._0_4_ = auVar156._0_4_ * auVar107._0_4_;
        auVar112._4_4_ = auVar156._4_4_ * auVar107._4_4_;
        auVar112._8_4_ = auVar156._8_4_ * auVar107._8_4_;
        auVar112._12_4_ = auVar156._12_4_ * auVar107._12_4_;
        auVar112._16_4_ = auVar156._16_4_ * auVar107._16_4_;
        auVar112._20_4_ = auVar156._20_4_ * auVar107._20_4_;
        auVar112._24_4_ = auVar156._24_4_ * auVar107._24_4_;
        auVar112._28_4_ = 0;
        auVar102 = vfmsub231ps_fma(auVar112,auVar133,auVar114);
        auVar35._4_4_ = auVar134._4_4_ * auVar114._4_4_;
        auVar35._0_4_ = auVar134._0_4_ * auVar114._0_4_;
        auVar35._8_4_ = auVar134._8_4_ * auVar114._8_4_;
        auVar35._12_4_ = auVar134._12_4_ * auVar114._12_4_;
        auVar35._16_4_ = auVar134._16_4_ * auVar114._16_4_;
        auVar35._20_4_ = auVar134._20_4_ * auVar114._20_4_;
        auVar35._24_4_ = auVar134._24_4_ * auVar114._24_4_;
        auVar35._28_4_ = auVar114._28_4_;
        auVar170 = vfmsub231ps_fma(auVar35,auVar185,auVar156);
        auVar36._4_4_ = auVar133._4_4_ * auVar185._4_4_;
        auVar36._0_4_ = auVar133._0_4_ * auVar185._0_4_;
        auVar36._8_4_ = auVar133._8_4_ * auVar185._8_4_;
        auVar36._12_4_ = auVar133._12_4_ * auVar185._12_4_;
        auVar36._16_4_ = auVar133._16_4_ * auVar185._16_4_;
        auVar36._20_4_ = auVar133._20_4_ * auVar185._20_4_;
        auVar36._24_4_ = auVar133._24_4_ * auVar185._24_4_;
        auVar36._28_4_ = auVar205._28_4_;
        auVar101 = vfmsub231ps_fma(auVar36,auVar134,auVar107);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
        auVar170 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar170));
        auVar107 = vmaxps_avx(ZEXT1632(auVar128),ZEXT1632(auVar170));
        auVar107 = vcmpps_avx(auVar107,ZEXT832(0) << 0x20,2);
        auVar102 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
        auVar127 = vpand_avx(auVar102,auVar127);
        auVar107 = vpmovsxwd_avx2(auVar127);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0x7f,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0xbf,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar107[0x1f]) {
LAB_016198be:
          auVar177._8_8_ = local_5a0[1]._8_8_;
          auVar177._0_8_ = local_5a0[1]._0_8_;
          auVar177._16_8_ = local_5a0[1]._16_8_;
          auVar177._24_8_ = local_5a0[1]._24_8_;
          auVar201._8_4_ = local_660;
          auVar201._0_8_ = uVar100;
          auVar201._12_4_ = fStack_65c;
          auVar201._16_4_ = local_660;
          auVar201._20_4_ = fStack_65c;
          auVar201._24_4_ = local_660;
          auVar201._28_4_ = fStack_65c;
        }
        else {
          auVar37._4_4_ = auVar21._4_4_ * auVar156._4_4_;
          auVar37._0_4_ = auVar21._0_4_ * auVar156._0_4_;
          auVar37._8_4_ = auVar21._8_4_ * auVar156._8_4_;
          auVar37._12_4_ = auVar21._12_4_ * auVar156._12_4_;
          auVar37._16_4_ = auVar21._16_4_ * auVar156._16_4_;
          auVar37._20_4_ = auVar21._20_4_ * auVar156._20_4_;
          auVar37._24_4_ = auVar21._24_4_ * auVar156._24_4_;
          auVar37._28_4_ = auVar107._28_4_;
          auVar169 = vfmsub231ps_fma(auVar37,auVar134,auVar108);
          auVar136._0_4_ = auVar108._0_4_ * auVar133._0_4_;
          auVar136._4_4_ = auVar108._4_4_ * auVar133._4_4_;
          auVar136._8_4_ = auVar108._8_4_ * auVar133._8_4_;
          auVar136._12_4_ = auVar108._12_4_ * auVar133._12_4_;
          auVar136._16_4_ = auVar108._16_4_ * auVar133._16_4_;
          auVar136._20_4_ = auVar108._20_4_ * auVar133._20_4_;
          auVar136._24_4_ = auVar108._24_4_ * auVar133._24_4_;
          auVar136._28_4_ = 0;
          auVar126 = vfmsub231ps_fma(auVar136,auVar16,auVar156);
          auVar38._4_4_ = auVar16._4_4_ * auVar134._4_4_;
          auVar38._0_4_ = auVar16._0_4_ * auVar134._0_4_;
          auVar38._8_4_ = auVar16._8_4_ * auVar134._8_4_;
          auVar38._12_4_ = auVar16._12_4_ * auVar134._12_4_;
          auVar38._16_4_ = auVar16._16_4_ * auVar134._16_4_;
          auVar38._20_4_ = auVar16._20_4_ * auVar134._20_4_;
          auVar38._24_4_ = auVar16._24_4_ * auVar134._24_4_;
          auVar38._28_4_ = auVar185._28_4_;
          auVar178 = vfmsub231ps_fma(auVar38,auVar133,auVar21);
          auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar126),ZEXT1632(auVar178));
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar169),_DAT_01faff00);
          auVar107 = vrcpps_avx(ZEXT1632(auVar101));
          auVar210._8_4_ = 0x3f800000;
          auVar210._0_8_ = 0x3f8000003f800000;
          auVar210._12_4_ = 0x3f800000;
          auVar210._16_4_ = 0x3f800000;
          auVar210._20_4_ = 0x3f800000;
          auVar210._24_4_ = 0x3f800000;
          auVar210._28_4_ = 0x3f800000;
          auVar102 = vfnmadd213ps_fma(auVar107,ZEXT1632(auVar101),auVar210);
          auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar107,auVar107);
          auVar189._0_4_ = auVar178._0_4_ * auVar9._0_4_;
          auVar189._4_4_ = auVar178._4_4_ * auVar9._4_4_;
          auVar189._8_4_ = auVar178._8_4_ * auVar9._8_4_;
          auVar189._12_4_ = auVar178._12_4_ * auVar9._12_4_;
          auVar189._16_4_ = auVar9._16_4_ * 0.0;
          auVar189._20_4_ = auVar9._20_4_ * 0.0;
          auVar189._24_4_ = auVar9._24_4_ * 0.0;
          auVar189._28_4_ = 0;
          auVar126 = vfmadd231ps_fma(auVar189,auVar115,ZEXT1632(auVar126));
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT1632(auVar169),auVar141);
          fVar147 = auVar102._0_4_;
          fVar119 = auVar102._4_4_;
          fVar120 = auVar102._8_4_;
          fVar121 = auVar102._12_4_;
          auVar185 = ZEXT1632(CONCAT412(fVar121 * auVar126._12_4_,
                                        CONCAT48(fVar120 * auVar126._8_4_,
                                                 CONCAT44(fVar119 * auVar126._4_4_,
                                                          fVar147 * auVar126._0_4_))));
          auVar113._4_4_ = uVar99;
          auVar113._0_4_ = uVar99;
          auVar113._8_4_ = uVar99;
          auVar113._12_4_ = uVar99;
          auVar113._16_4_ = uVar99;
          auVar113._20_4_ = uVar99;
          auVar113._24_4_ = uVar99;
          auVar113._28_4_ = uVar99;
          uVar211 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar137._4_4_ = uVar211;
          auVar137._0_4_ = uVar211;
          auVar137._8_4_ = uVar211;
          auVar137._12_4_ = uVar211;
          auVar137._16_4_ = uVar211;
          auVar137._20_4_ = uVar211;
          auVar137._24_4_ = uVar211;
          auVar137._28_4_ = uVar211;
          auVar115 = vcmpps_avx(auVar113,auVar185,2);
          auVar107 = vcmpps_avx(auVar185,auVar137,2);
          auVar115 = vandps_avx(auVar107,auVar115);
          auVar102 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
          auVar127 = vpand_avx(auVar127,auVar102);
          auVar115 = vpmovsxwd_avx2(auVar127);
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0x7f,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0xbf,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar115[0x1f]) goto LAB_016198be;
          auVar115 = vcmpps_avx(ZEXT1632(auVar101),ZEXT832(0) << 0x20,4);
          auVar102 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
          auVar127 = vpand_avx(auVar127,auVar102);
          auVar115 = vpmovsxwd_avx2(auVar127);
          auVar177._8_8_ = local_5a0[1]._8_8_;
          auVar177._0_8_ = local_5a0[1]._0_8_;
          auVar177._16_8_ = local_5a0[1]._16_8_;
          auVar177._24_8_ = local_5a0[1]._24_8_;
          auVar201._8_4_ = local_660;
          auVar201._0_8_ = uVar100;
          auVar201._12_4_ = fStack_65c;
          auVar201._16_4_ = local_660;
          auVar201._20_4_ = fStack_65c;
          auVar201._24_4_ = local_660;
          auVar201._28_4_ = fStack_65c;
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar115 >> 0x7f,0) != '\0') ||
                (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar115 >> 0xbf,0) != '\0') ||
              (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar115[0x1f] < '\0') {
            auVar114 = ZEXT1632(CONCAT412(fVar121 * auVar128._12_4_,
                                          CONCAT48(fVar120 * auVar128._8_4_,
                                                   CONCAT44(fVar119 * auVar128._4_4_,
                                                            fVar147 * auVar128._0_4_))));
            auVar138 = ZEXT1632(CONCAT412(fVar121 * auVar170._12_4_,
                                          CONCAT48(fVar120 * auVar170._8_4_,
                                                   CONCAT44(fVar119 * auVar170._4_4_,
                                                            fVar147 * auVar170._0_4_))));
            auVar176._8_4_ = 0x3f800000;
            auVar176._0_8_ = 0x3f8000003f800000;
            auVar176._12_4_ = 0x3f800000;
            auVar176._16_4_ = 0x3f800000;
            auVar176._20_4_ = 0x3f800000;
            auVar176._24_4_ = 0x3f800000;
            auVar176._28_4_ = 0x3f800000;
            auVar107 = vsubps_avx(auVar176,auVar114);
            _local_180 = vblendvps_avx(auVar107,auVar114,auVar116);
            auVar107 = vsubps_avx(auVar176,auVar138);
            local_3a0 = vblendvps_avx(auVar107,auVar138,auVar116);
            auVar177 = auVar115;
            local_520 = auVar185;
          }
        }
        auVar229 = ZEXT3264(local_780);
        auVar223 = ZEXT3264(local_760);
        auVar219 = ZEXT3264(_local_640);
        auVar146 = ZEXT3264(auVar226);
        if ((((((((auVar177 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar177 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar177 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar177 >> 0x7f,0) == '\0') &&
              (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar177 >> 0xbf,0) == '\0') &&
            (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar177[0x1f]) {
          auVar146 = ZEXT3264(local_680);
          auVar168 = ZEXT3264(local_5c0);
          auVar199 = ZEXT3264(auVar201);
        }
        else {
          auVar115 = vsubps_avx(ZEXT1632(auVar160),auVar188);
          auVar127 = vfmadd213ps_fma(auVar115,_local_180,auVar188);
          fVar147 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar39._4_4_ = (auVar127._4_4_ + auVar127._4_4_) * fVar147;
          auVar39._0_4_ = (auVar127._0_4_ + auVar127._0_4_) * fVar147;
          auVar39._8_4_ = (auVar127._8_4_ + auVar127._8_4_) * fVar147;
          auVar39._12_4_ = (auVar127._12_4_ + auVar127._12_4_) * fVar147;
          auVar39._16_4_ = fVar147 * 0.0;
          auVar39._20_4_ = fVar147 * 0.0;
          auVar39._24_4_ = fVar147 * 0.0;
          auVar39._28_4_ = 0;
          auVar115 = vcmpps_avx(local_520,auVar39,6);
          auVar107 = auVar177 & auVar115;
          auVar168 = ZEXT3264(auVar214);
          auVar199 = ZEXT3264(auVar201);
          if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar107 >> 0x7f,0) == '\0') &&
                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0xbf,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar107[0x1f]) {
            auVar146 = ZEXT3264(local_680);
            auVar168 = ZEXT3264(local_5c0);
          }
          else {
            auVar139._8_4_ = 0xbf800000;
            auVar139._0_8_ = 0xbf800000bf800000;
            auVar139._12_4_ = 0xbf800000;
            auVar139._16_4_ = 0xbf800000;
            auVar139._20_4_ = 0xbf800000;
            auVar139._24_4_ = 0xbf800000;
            auVar139._28_4_ = 0xbf800000;
            auVar158._8_4_ = 0x40000000;
            auVar158._0_8_ = 0x4000000040000000;
            auVar158._12_4_ = 0x40000000;
            auVar158._16_4_ = 0x40000000;
            auVar158._20_4_ = 0x40000000;
            auVar158._24_4_ = 0x40000000;
            auVar158._28_4_ = 0x40000000;
            auVar127 = vfmadd213ps_fma(local_3a0,auVar158,auVar139);
            local_2c0 = _local_180;
            local_3a0 = ZEXT1632(auVar127);
            auVar107 = local_3a0;
            local_2a0 = ZEXT1632(auVar127);
            local_280 = local_520;
            local_260 = 0;
            local_25c = iVar12;
            local_250 = uVar79;
            uStack_248 = uVar80;
            local_240 = uVar81;
            uStack_238 = uVar82;
            local_230 = uVar83;
            uStack_228 = uVar84;
            local_220 = uVar85;
            uStack_218 = uVar86;
            local_3a0 = auVar107;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5a0[0] = vandps_avx(auVar115,auVar177);
              fVar147 = 1.0 / auVar110._0_4_;
              local_1e0[0] = fVar147 * ((float)local_180._0_4_ + 0.0);
              local_1e0[1] = fVar147 * ((float)local_180._4_4_ + 1.0);
              local_1e0[2] = fVar147 * (fStack_178 + 2.0);
              local_1e0[3] = fVar147 * (fStack_174 + 3.0);
              fStack_1d0 = fVar147 * (fStack_170 + 4.0);
              fStack_1cc = fVar147 * (fStack_16c + 5.0);
              fStack_1c8 = fVar147 * (fStack_168 + 6.0);
              fStack_1c4 = fStack_164 + 7.0;
              local_3a0._0_8_ = auVar127._0_8_;
              local_3a0._8_8_ = auVar127._8_8_;
              local_1c0 = local_3a0._0_8_;
              uStack_1b8 = local_3a0._8_8_;
              uStack_1b0 = 0;
              uStack_1a8 = 0;
              local_1a0 = local_520;
              auVar140._8_4_ = 0x7f800000;
              auVar140._0_8_ = 0x7f8000007f800000;
              auVar140._12_4_ = 0x7f800000;
              auVar140._16_4_ = 0x7f800000;
              auVar140._20_4_ = 0x7f800000;
              auVar140._24_4_ = 0x7f800000;
              auVar140._28_4_ = 0x7f800000;
              auVar115 = vblendvps_avx(auVar140,local_520,local_5a0[0]);
              auVar107 = vshufps_avx(auVar115,auVar115,0xb1);
              auVar107 = vminps_avx(auVar115,auVar107);
              auVar185 = vshufpd_avx(auVar107,auVar107,5);
              auVar107 = vminps_avx(auVar107,auVar185);
              auVar185 = vpermpd_avx2(auVar107,0x4e);
              auVar107 = vminps_avx(auVar107,auVar185);
              auVar107 = vcmpps_avx(auVar115,auVar107,0);
              auVar185 = local_5a0[0] & auVar107;
              auVar115 = local_5a0[0];
              if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar185 >> 0x7f,0) != '\0') ||
                    (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar185 >> 0xbf,0) != '\0') ||
                  (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar185[0x1f] < '\0') {
                auVar115 = vandps_avx(auVar107,local_5a0[0]);
              }
              uVar93 = vmovmskps_avx(auVar115);
              uVar22 = 0;
              for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                uVar22 = uVar22 + 1;
              }
              uVar94 = (ulong)uVar22;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar147 = local_1e0[uVar94];
                fVar119 = 1.0 - fVar147;
                auVar106 = ZEXT416((uint)fVar147);
                auVar165 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar106,
                                           ZEXT416(0xc0a00000));
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * 3.0)),
                                          ZEXT416((uint)(fVar147 + fVar147)),auVar165);
                auVar165 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar106,
                                           ZEXT416(0x40000000));
                auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * fVar119 * -3.0)),
                                           ZEXT416((uint)(fVar119 + fVar119)),auVar165);
                auVar127 = vfnmadd231ss_fma(ZEXT416((uint)(fVar147 * (fVar119 + fVar119))),
                                            ZEXT416((uint)fVar119),ZEXT416((uint)fVar119));
                auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),auVar106,
                                           ZEXT416((uint)(fVar119 * -2.0)));
                fVar119 = auVar165._0_4_ * 0.5;
                fVar120 = auVar106._0_4_ * 0.5;
                auVar161._0_4_ = fVar120 * local_820;
                auVar161._4_4_ = fVar120 * fStack_81c;
                auVar161._8_4_ = fVar120 * fStack_818;
                auVar161._12_4_ = fVar120 * fStack_814;
                auVar129._4_4_ = fVar119;
                auVar129._0_4_ = fVar119;
                auVar129._8_4_ = fVar119;
                auVar129._12_4_ = fVar119;
                auVar165 = vfmadd132ps_fma(auVar129,auVar161,*pauVar3);
                fVar119 = auVar17._0_4_ * 0.5;
                auVar162._4_4_ = fVar119;
                auVar162._0_4_ = fVar119;
                auVar162._8_4_ = fVar119;
                auVar162._12_4_ = fVar119;
                auVar165 = vfmadd132ps_fma(auVar162,auVar165,*pauVar2);
                uVar211 = *(undefined4 *)((long)&local_1c0 + uVar94 * 4);
                fVar119 = auVar127._0_4_ * 0.5;
                auVar150._4_4_ = fVar119;
                auVar150._0_4_ = fVar119;
                auVar150._8_4_ = fVar119;
                auVar150._12_4_ = fVar119;
                auVar165 = vfmadd132ps_fma(auVar150,auVar165,*pauVar1);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar94 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
                uVar13 = vextractps_avx(auVar165,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                uVar13 = vextractps_avx(auVar165,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
                *(float *)(ray + k * 4 + 0xf0) = fVar147;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar211;
                *(uint *)(ray + k * 4 + 0x110) = uVar11;
                *(uint *)(ray + k * 4 + 0x120) = uVar92;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_6e0._4_4_ = uVar92;
                local_6e0._0_4_ = uVar92;
                local_6e0._8_4_ = uVar92;
                local_6e0._16_16_ = auVar141._16_16_;
                local_6e0._12_4_ = uVar92;
                local_5e0._4_4_ = uVar11;
                local_5e0._0_4_ = uVar11;
                local_5e0._8_4_ = uVar11;
                local_5e0._16_16_ = auVar9._16_16_;
                local_5e0._12_4_ = uVar11;
                local_600 = ZEXT1632(*local_690);
                local_700 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                local_6c0 = auVar226;
                local_688 = ray;
                local_620 = auVar214;
                _local_4e0 = auVar118;
                while( true ) {
                  fVar147 = local_1e0[uVar94];
                  local_420._4_4_ = fVar147;
                  local_420._0_4_ = fVar147;
                  local_420._8_4_ = fVar147;
                  local_420._12_4_ = fVar147;
                  local_410 = *(undefined4 *)((long)&local_1c0 + uVar94 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar94 * 4);
                  fVar119 = 1.0 - fVar147;
                  auVar127 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                             ZEXT416(0xc0a00000));
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * 3.0)),
                                             ZEXT416((uint)(fVar147 + fVar147)),auVar127);
                  auVar127 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                             ZEXT416(0x40000000));
                  auVar127 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * fVar119 * -3.0)),
                                             ZEXT416((uint)(fVar119 + fVar119)),auVar127);
                  auVar160 = vfnmadd231ss_fma(ZEXT416((uint)(fVar147 * (fVar119 + fVar119))),
                                              ZEXT416((uint)fVar119),ZEXT416((uint)fVar119));
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),local_420,
                                             ZEXT416((uint)(fVar119 * -2.0)));
                  fVar147 = auVar127._0_4_ * 0.5;
                  fVar119 = auVar128._0_4_ * 0.5;
                  auVar174._0_4_ = fVar119 * local_820;
                  auVar174._4_4_ = fVar119 * fStack_81c;
                  auVar174._8_4_ = fVar119 * fStack_818;
                  auVar174._12_4_ = fVar119 * fStack_814;
                  auVar154._4_4_ = fVar147;
                  auVar154._0_4_ = fVar147;
                  auVar154._8_4_ = fVar147;
                  auVar154._12_4_ = fVar147;
                  auVar127 = vfmadd132ps_fma(auVar154,auVar174,auVar165);
                  fVar147 = auVar102._0_4_ * 0.5;
                  auVar175._4_4_ = fVar147;
                  auVar175._0_4_ = fVar147;
                  auVar175._8_4_ = fVar147;
                  auVar175._12_4_ = fVar147;
                  auVar127 = vfmadd132ps_fma(auVar175,auVar127,auVar17);
                  local_730.context = context->user;
                  fVar147 = auVar160._0_4_ * 0.5;
                  auVar155._4_4_ = fVar147;
                  auVar155._0_4_ = fVar147;
                  auVar155._8_4_ = fVar147;
                  auVar155._12_4_ = fVar147;
                  auVar102 = vfmadd132ps_fma(auVar155,auVar127,auVar106);
                  local_450 = auVar102._0_4_;
                  uStack_44c = local_450;
                  uStack_448 = local_450;
                  uStack_444 = local_450;
                  auVar127 = vshufps_avx(auVar102,auVar102,0x55);
                  local_440 = auVar127;
                  local_430 = vshufps_avx(auVar102,auVar102,0xaa);
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  local_400 = local_5e0._0_8_;
                  uStack_3f8 = local_5e0._8_8_;
                  local_3f0 = local_6e0._0_16_;
                  vpcmpeqd_avx2(ZEXT1632(local_6e0._0_16_),ZEXT1632(local_6e0._0_16_));
                  uStack_3dc = (local_730.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_730.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_7b0 = local_600._0_16_;
                  local_730.valid = (int *)local_7b0;
                  local_730.geometryUserPtr = pGVar14->userPtr;
                  local_730.hit = (RTCHitN *)&local_450;
                  local_730.N = 4;
                  local_730.ray = (RTCRayN *)ray;
                  if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar14->intersectionFilterN)(&local_730);
                    auVar219 = ZEXT3264(_local_640);
                    auVar168 = ZEXT3264(local_620);
                    auVar146 = ZEXT3264(local_6c0);
                    auVar229 = ZEXT3264(local_780);
                    auVar223 = ZEXT3264(local_760);
                    auVar199 = ZEXT3264(CONCAT428(fStack_644,
                                                  CONCAT424(fStack_648,
                                                            CONCAT420(fStack_64c,
                                                                      CONCAT416(fStack_650,
                                                                                CONCAT412(fStack_654
                                                                                          ,CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                    ray = local_688;
                    pre = local_790;
                    prim = local_788;
                    pLVar96 = local_798;
                  }
                  if (local_7b0 == (undefined1  [16])0x0) {
                    auVar127 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar127 = auVar127 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_730);
                      auVar219 = ZEXT3264(_local_640);
                      auVar168 = ZEXT3264(local_620);
                      auVar146 = ZEXT3264(local_6c0);
                      auVar229 = ZEXT3264(local_780);
                      auVar223 = ZEXT3264(local_760);
                      auVar199 = ZEXT3264(CONCAT428(fStack_644,
                                                    CONCAT424(fStack_648,
                                                              CONCAT420(fStack_64c,
                                                                        CONCAT416(fStack_650,
                                                                                  CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                      ray = local_688;
                      pre = local_790;
                      prim = local_788;
                      pLVar96 = local_798;
                    }
                    auVar102 = vpcmpeqd_avx(local_7b0,_DAT_01f7aa10);
                    auVar128 = vpcmpeqd_avx(auVar127,auVar127);
                    auVar127 = auVar102 ^ auVar128;
                    if (local_7b0 != (undefined1  [16])0x0) {
                      auVar102 = auVar102 ^ auVar128;
                      auVar128 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])local_730.hit);
                      *(undefined1 (*) [16])(local_730.ray + 0xc0) = auVar128;
                      auVar128 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                          (local_730.hit + 0x10));
                      *(undefined1 (*) [16])(local_730.ray + 0xd0) = auVar128;
                      auVar128 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                          (local_730.hit + 0x20));
                      *(undefined1 (*) [16])(local_730.ray + 0xe0) = auVar128;
                      auVar128 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                          (local_730.hit + 0x30));
                      *(undefined1 (*) [16])(local_730.ray + 0xf0) = auVar128;
                      auVar128 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                          (local_730.hit + 0x40));
                      *(undefined1 (*) [16])(local_730.ray + 0x100) = auVar128;
                      auVar128 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                          (local_730.hit + 0x50));
                      *(undefined1 (*) [16])(local_730.ray + 0x110) = auVar128;
                      auVar128 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                          (local_730.hit + 0x60));
                      *(undefined1 (*) [16])(local_730.ray + 0x120) = auVar128;
                      auVar128 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                          (local_730.hit + 0x70));
                      *(undefined1 (*) [16])(local_730.ray + 0x130) = auVar128;
                      auVar102 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                          (local_730.hit + 0x80));
                      *(undefined1 (*) [16])(local_730.ray + 0x140) = auVar102;
                    }
                  }
                  auVar115 = local_520;
                  auVar141 = local_700;
                  auVar214 = auVar168._0_32_;
                  auVar226 = auVar146._0_32_;
                  auVar132._8_8_ = 0x100000001;
                  auVar132._0_8_ = 0x100000001;
                  if ((auVar132 & auVar127) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_700._0_4_;
                  }
                  else {
                    local_700._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_700._4_4_ = 0;
                    local_700._8_4_ = 0;
                    local_700._12_4_ = 0;
                  }
                  *(undefined4 *)(local_5a0[0] + uVar94 * 4) = 0;
                  local_700._16_16_ = auVar141._16_16_;
                  auVar118._4_4_ = local_700._0_4_;
                  auVar118._0_4_ = local_700._0_4_;
                  auVar118._8_4_ = local_700._0_4_;
                  auVar118._12_4_ = local_700._0_4_;
                  auVar118._16_4_ = local_700._0_4_;
                  auVar118._20_4_ = local_700._0_4_;
                  auVar118._24_4_ = local_700._0_4_;
                  auVar118._28_4_ = local_700._0_4_;
                  auVar9 = vcmpps_avx(auVar115,auVar118,2);
                  auVar141 = vandps_avx(auVar9,local_5a0[0]);
                  local_5a0[0] = local_5a0[0] & auVar9;
                  if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                           && (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) &&
                          (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                         && SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                        (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                      (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5a0[0][0x1f]) break;
                  auVar145._8_4_ = 0x7f800000;
                  auVar145._0_8_ = 0x7f8000007f800000;
                  auVar145._12_4_ = 0x7f800000;
                  auVar145._16_4_ = 0x7f800000;
                  auVar145._20_4_ = 0x7f800000;
                  auVar145._24_4_ = 0x7f800000;
                  auVar145._28_4_ = 0x7f800000;
                  auVar115 = vblendvps_avx(auVar145,auVar115,auVar141);
                  auVar9 = vshufps_avx(auVar115,auVar115,0xb1);
                  auVar9 = vminps_avx(auVar115,auVar9);
                  auVar107 = vshufpd_avx(auVar9,auVar9,5);
                  auVar9 = vminps_avx(auVar9,auVar107);
                  auVar107 = vpermpd_avx2(auVar9,0x4e);
                  auVar9 = vminps_avx(auVar9,auVar107);
                  auVar9 = vcmpps_avx(auVar115,auVar9,0);
                  auVar107 = auVar141 & auVar9;
                  auVar115 = auVar141;
                  if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar107 >> 0x7f,0) != '\0') ||
                        (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar107 >> 0xbf,0) != '\0') ||
                      (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar107[0x1f] < '\0') {
                    auVar115 = vandps_avx(auVar9,auVar141);
                  }
                  uVar93 = vmovmskps_avx(auVar115);
                  uVar22 = 0;
                  for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                    uVar22 = uVar22 + 1;
                  }
                  uVar94 = (ulong)uVar22;
                  local_5a0[0] = auVar141;
                }
              }
            }
            auVar146 = ZEXT3264(local_680);
            auVar168 = ZEXT3264(local_5c0);
          }
        }
      }
      if (8 < iVar12) {
        _local_640 = auVar219._0_32_;
        local_360._4_4_ = iVar12;
        local_360._0_4_ = iVar12;
        local_360._8_4_ = iVar12;
        local_360._12_4_ = iVar12;
        local_360._16_4_ = iVar12;
        local_360._20_4_ = iVar12;
        local_360._24_4_ = iVar12;
        local_360._28_4_ = iVar12;
        local_120 = fVar148;
        fStack_11c = fVar148;
        fStack_118 = fVar148;
        fStack_114 = fVar148;
        fStack_110 = fVar148;
        fStack_10c = fVar148;
        fStack_108 = fVar148;
        fStack_104 = fVar148;
        local_140 = uVar99;
        uStack_13c = uVar99;
        uStack_138 = uVar99;
        uStack_134 = uVar99;
        uStack_130 = uVar99;
        uStack_12c = uVar99;
        uStack_128 = uVar99;
        uStack_124 = uVar99;
        local_160 = 1.0 / (float)local_500._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_2f0 = uVar92;
        uStack_2ec = uVar92;
        uStack_2e8 = uVar92;
        uStack_2e4 = uVar92;
        local_300 = uVar11;
        uStack_2fc = uVar11;
        uStack_2f8 = uVar11;
        uStack_2f4 = uVar11;
        lVar98 = 8;
        local_6c0 = auVar226;
        local_620 = auVar214;
        do {
          auVar141 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar98 * 4 + lVar23);
          auVar115 = *(undefined1 (*) [32])(lVar23 + 0x21b37f0 + lVar98 * 4);
          auVar9 = *(undefined1 (*) [32])(lVar23 + 0x21b3c74 + lVar98 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar23 + 0x21b40f8 + lVar98 * 4);
          auVar91 = *pauVar5;
          auVar220._0_4_ = local_480 * *(float *)*pauVar5;
          auVar220._4_4_ = fStack_47c * *(float *)(*pauVar5 + 4);
          auVar220._8_4_ = fStack_478 * *(float *)(*pauVar5 + 8);
          auVar220._12_4_ = fStack_474 * *(float *)(*pauVar5 + 0xc);
          auVar220._16_4_ = fStack_470 * *(float *)(*pauVar5 + 0x10);
          auVar220._20_4_ = fStack_46c * *(float *)(*pauVar5 + 0x14);
          auVar220._28_36_ = auVar219._28_36_;
          auVar220._24_4_ = fStack_468 * *(float *)(*pauVar5 + 0x18);
          auVar40._4_4_ = auVar199._4_4_ * *(float *)(*pauVar5 + 4);
          auVar40._0_4_ = auVar199._0_4_ * *(float *)*pauVar5;
          auVar40._8_4_ = auVar199._8_4_ * *(float *)(*pauVar5 + 8);
          auVar40._12_4_ = auVar199._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar40._16_4_ = auVar199._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar40._20_4_ = auVar199._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar40._24_4_ = auVar199._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar40._28_4_ = *(undefined4 *)pauVar5[1];
          auVar165 = vfmadd231ps_fma(auVar220._0_32_,auVar9,auVar146._0_32_);
          auVar17 = vfmadd231ps_fma(auVar40,auVar9,auVar168._0_32_);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar115,auVar223._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar115,local_4c0);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar141,auVar229._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar141,local_4a0);
          auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar98 * 4 + lVar23);
          auVar185 = *(undefined1 (*) [32])(lVar23 + 0x21b5c10 + lVar98 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar23 + 0x21b6094 + lVar98 * 4);
          pfVar6 = (float *)(lVar23 + 0x21b6518 + lVar98 * 4);
          fVar124 = *pfVar6;
          fVar72 = pfVar6[1];
          fVar73 = pfVar6[2];
          fVar74 = pfVar6[3];
          fVar75 = pfVar6[4];
          fVar76 = pfVar6[5];
          fVar77 = pfVar6[6];
          auVar41._4_4_ = fStack_47c * fVar72;
          auVar41._0_4_ = local_480 * fVar124;
          auVar41._8_4_ = fStack_478 * fVar73;
          auVar41._12_4_ = fStack_474 * fVar74;
          auVar41._16_4_ = fStack_470 * fVar75;
          auVar41._20_4_ = fStack_46c * fVar76;
          auVar41._24_4_ = fStack_468 * fVar77;
          auVar41._28_4_ = auVar141._28_4_;
          auVar42._4_4_ = auVar199._4_4_ * fVar72;
          auVar42._0_4_ = auVar199._0_4_ * fVar124;
          auVar42._8_4_ = auVar199._8_4_ * fVar73;
          auVar42._12_4_ = auVar199._12_4_ * fVar74;
          auVar42._16_4_ = auVar199._16_4_ * fVar75;
          auVar42._20_4_ = auVar199._20_4_ * fVar76;
          auVar42._24_4_ = auVar199._24_4_ * fVar77;
          auVar42._28_4_ = fStack_464;
          auVar106 = vfmadd231ps_fma(auVar41,auVar114,auVar146._0_32_);
          auVar127 = vfmadd231ps_fma(auVar42,auVar114,auVar168._0_32_);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar185,auVar223._0_32_);
          auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar185,local_4c0);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar107,auVar229._0_32_);
          auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar107,local_4a0);
          local_600 = ZEXT1632(auVar106);
          local_340 = ZEXT1632(auVar165);
          auVar205 = vsubps_avx(local_600,local_340);
          local_5e0 = ZEXT1632(auVar127);
          local_320 = ZEXT1632(auVar17);
          _local_4e0 = vsubps_avx(local_5e0,local_320);
          auVar71._4_4_ = auVar205._4_4_ * auVar17._4_4_;
          auVar71._0_4_ = auVar205._0_4_ * auVar17._0_4_;
          auVar71._8_4_ = auVar205._8_4_ * auVar17._8_4_;
          auVar71._12_4_ = auVar205._12_4_ * auVar17._12_4_;
          auVar71._16_4_ = auVar205._16_4_ * 0.0;
          auVar71._20_4_ = auVar205._20_4_ * 0.0;
          auVar71._24_4_ = auVar205._24_4_ * 0.0;
          auVar71._28_4_ = local_4c0._28_4_;
          local_7e0._0_4_ = auVar91._0_4_;
          local_7e0._4_4_ = auVar91._4_4_;
          fStack_7d8 = auVar91._8_4_;
          fStack_7d4 = auVar91._12_4_;
          auStack_7d0._0_4_ = auVar91._16_4_;
          auStack_7d0._4_4_ = auVar91._20_4_;
          fStack_7c8 = auVar91._24_4_;
          fVar148 = local_4e0._0_4_;
          auVar223._0_4_ = auVar165._0_4_ * fVar148;
          fVar147 = local_4e0._4_4_;
          auVar223._4_4_ = auVar165._4_4_ * fVar147;
          fVar119 = local_4e0._8_4_;
          auVar223._8_4_ = auVar165._8_4_ * fVar119;
          fVar120 = local_4e0._12_4_;
          auVar223._12_4_ = auVar165._12_4_ * fVar120;
          fVar121 = local_4e0._16_4_;
          auVar223._16_4_ = fVar121 * 0.0;
          fVar122 = local_4e0._20_4_;
          auVar223._20_4_ = fVar122 * 0.0;
          fVar123 = local_4e0._24_4_;
          auVar223._28_36_ = auVar146._28_36_;
          auVar223._24_4_ = fVar123 * 0.0;
          auVar219 = ZEXT3264(auVar9);
          auVar118 = vsubps_avx(auVar71,auVar223._0_32_);
          auVar43._4_4_ = local_e0._4_4_ * (float)local_7e0._4_4_;
          auVar43._0_4_ = (float)local_e0 * (float)local_7e0._0_4_;
          auVar43._8_4_ = (float)uStack_d8 * fStack_7d8;
          auVar43._12_4_ = uStack_d8._4_4_ * fStack_7d4;
          auVar43._16_4_ = (float)uStack_d0 * (float)auStack_7d0._0_4_;
          auVar43._20_4_ = uStack_d0._4_4_ * (float)auStack_7d0._4_4_;
          auVar43._24_4_ = (float)uStack_c8 * fStack_7c8;
          auVar43._28_4_ = local_4c0._28_4_;
          auVar165 = vfmadd231ps_fma(auVar43,auVar9,local_c0);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar115,local_a0);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_80,auVar141);
          auVar44._4_4_ = local_e0._4_4_ * fVar72;
          auVar44._0_4_ = (float)local_e0 * fVar124;
          auVar44._8_4_ = (float)uStack_d8 * fVar73;
          auVar44._12_4_ = uStack_d8._4_4_ * fVar74;
          auVar44._16_4_ = (float)uStack_d0 * fVar75;
          auVar44._20_4_ = uStack_d0._4_4_ * fVar76;
          auVar44._24_4_ = (float)uStack_c8 * fVar77;
          auVar44._28_4_ = uStack_c8._4_4_;
          auVar17 = vfmadd231ps_fma(auVar44,auVar114,local_c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar185,local_a0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,local_80);
          auVar45._4_4_ = fVar147 * fVar147;
          auVar45._0_4_ = fVar148 * fVar148;
          auVar45._8_4_ = fVar119 * fVar119;
          auVar45._12_4_ = fVar120 * fVar120;
          auVar45._16_4_ = fVar121 * fVar121;
          auVar45._20_4_ = fVar122 * fVar122;
          auVar45._24_4_ = fVar123 * fVar123;
          auVar45._28_4_ = local_4e0._28_4_;
          auVar106 = vfmadd231ps_fma(auVar45,auVar205,auVar205);
          auVar116 = ZEXT1632(auVar165);
          auVar138 = vmaxps_avx(auVar116,ZEXT1632(auVar17));
          auVar202._0_4_ = auVar138._0_4_ * auVar138._0_4_ * auVar106._0_4_;
          auVar202._4_4_ = auVar138._4_4_ * auVar138._4_4_ * auVar106._4_4_;
          auVar202._8_4_ = auVar138._8_4_ * auVar138._8_4_ * auVar106._8_4_;
          auVar202._12_4_ = auVar138._12_4_ * auVar138._12_4_ * auVar106._12_4_;
          auVar202._16_4_ = auVar138._16_4_ * auVar138._16_4_ * 0.0;
          auVar202._20_4_ = auVar138._20_4_ * auVar138._20_4_ * 0.0;
          auVar202._24_4_ = auVar138._24_4_ * auVar138._24_4_ * 0.0;
          auVar202._28_4_ = 0;
          auVar46._4_4_ = auVar118._4_4_ * auVar118._4_4_;
          auVar46._0_4_ = auVar118._0_4_ * auVar118._0_4_;
          auVar46._8_4_ = auVar118._8_4_ * auVar118._8_4_;
          auVar46._12_4_ = auVar118._12_4_ * auVar118._12_4_;
          auVar46._16_4_ = auVar118._16_4_ * auVar118._16_4_;
          auVar46._20_4_ = auVar118._20_4_ * auVar118._20_4_;
          auVar46._24_4_ = auVar118._24_4_ * auVar118._24_4_;
          auVar46._28_4_ = auVar118._28_4_;
          auVar138 = vcmpps_avx(auVar46,auVar202,2);
          local_260 = (int)lVar98;
          auVar203._4_4_ = local_260;
          auVar203._0_4_ = local_260;
          auVar203._8_4_ = local_260;
          auVar203._12_4_ = local_260;
          auVar203._16_4_ = local_260;
          auVar203._20_4_ = local_260;
          auVar203._24_4_ = local_260;
          auVar203._28_4_ = local_260;
          auVar118 = vpor_avx2(auVar203,_DAT_01fe9900);
          auVar109 = vpcmpgtd_avx2(local_360,auVar118);
          auVar118 = auVar109 & auVar138;
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0x7f,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0xbf,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar118[0x1f]) {
            auVar199 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            auVar223 = ZEXT3264(local_760);
            auVar229 = ZEXT3264(local_780);
          }
          else {
            local_380 = vandps_avx(auVar109,auVar138);
            auVar47._4_4_ = (float)local_640._4_4_ * fVar72;
            auVar47._0_4_ = (float)local_640._0_4_ * fVar124;
            auVar47._8_4_ = fStack_638 * fVar73;
            auVar47._12_4_ = fStack_634 * fVar74;
            auVar47._16_4_ = fStack_630 * fVar75;
            auVar47._20_4_ = fStack_62c * fVar76;
            auVar47._24_4_ = fStack_628 * fVar77;
            auVar47._28_4_ = auVar138._28_4_;
            auVar165 = vfmadd213ps_fma(auVar114,local_620,auVar47);
            auVar165 = vfmadd213ps_fma(auVar185,local_6c0,ZEXT1632(auVar165));
            auVar165 = vfmadd213ps_fma(auVar107,local_560,ZEXT1632(auVar165));
            auVar48._4_4_ = (float)local_640._4_4_ * (float)local_7e0._4_4_;
            auVar48._0_4_ = (float)local_640._0_4_ * (float)local_7e0._0_4_;
            auVar48._8_4_ = fStack_638 * fStack_7d8;
            auVar48._12_4_ = fStack_634 * fStack_7d4;
            auVar48._16_4_ = fStack_630 * (float)auStack_7d0._0_4_;
            auVar48._20_4_ = fStack_62c * (float)auStack_7d0._4_4_;
            auVar48._24_4_ = fStack_628 * fStack_7c8;
            auVar48._28_4_ = auVar138._28_4_;
            auVar106 = vfmadd213ps_fma(auVar9,local_620,auVar48);
            auVar106 = vfmadd213ps_fma(auVar115,local_6c0,ZEXT1632(auVar106));
            auVar115 = *(undefined1 (*) [32])(lVar23 + 0x21b457c + lVar98 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar23 + 0x21b4a00 + lVar98 * 4);
            auVar185 = *(undefined1 (*) [32])(lVar23 + 0x21b4e84 + lVar98 * 4);
            pfVar6 = (float *)(lVar23 + 0x21b5308 + lVar98 * 4);
            fVar148 = *pfVar6;
            fVar147 = pfVar6[1];
            fVar119 = pfVar6[2];
            fVar120 = pfVar6[3];
            fVar121 = pfVar6[4];
            fVar122 = pfVar6[5];
            fVar123 = pfVar6[6];
            auVar197._0_4_ = fVar148 * local_480;
            auVar197._4_4_ = fVar147 * fStack_47c;
            auVar197._8_4_ = fVar119 * fStack_478;
            auVar197._12_4_ = fVar120 * fStack_474;
            auVar197._16_4_ = fVar121 * fStack_470;
            auVar197._20_4_ = fVar122 * fStack_46c;
            auVar197._24_4_ = fVar123 * fStack_468;
            auVar197._28_4_ = 0;
            auVar217._0_4_ = local_660 * fVar148;
            auVar217._4_4_ = fStack_65c * fVar147;
            auVar217._8_4_ = fStack_658 * fVar119;
            auVar217._12_4_ = fStack_654 * fVar120;
            auVar217._16_4_ = fStack_650 * fVar121;
            auVar217._20_4_ = fStack_64c * fVar122;
            auVar217._24_4_ = fStack_648 * fVar123;
            auVar217._28_4_ = 0;
            auVar49._4_4_ = fVar147 * (float)local_640._4_4_;
            auVar49._0_4_ = fVar148 * (float)local_640._0_4_;
            auVar49._8_4_ = fVar119 * fStack_638;
            auVar49._12_4_ = fVar120 * fStack_634;
            auVar49._16_4_ = fVar121 * fStack_630;
            auVar49._20_4_ = fVar122 * fStack_62c;
            auVar49._24_4_ = fVar123 * fStack_628;
            auVar49._28_4_ = pfVar6[7];
            auVar127 = vfmadd231ps_fma(auVar197,auVar185,local_680);
            auVar102 = vfmadd231ps_fma(auVar217,auVar185,local_5c0);
            auVar128 = vfmadd231ps_fma(auVar49,local_620,auVar185);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar107,local_760);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar107,local_4c0);
            auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),local_6c0,auVar107);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar115,local_780);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar115,local_4a0);
            auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),local_560,auVar115);
            pfVar6 = (float *)(lVar23 + 0x21b7728 + lVar98 * 4);
            fVar148 = *pfVar6;
            fVar147 = pfVar6[1];
            fVar119 = pfVar6[2];
            fVar120 = pfVar6[3];
            fVar121 = pfVar6[4];
            fVar122 = pfVar6[5];
            fVar123 = pfVar6[6];
            auVar50._4_4_ = fStack_47c * fVar147;
            auVar50._0_4_ = local_480 * fVar148;
            auVar50._8_4_ = fStack_478 * fVar119;
            auVar50._12_4_ = fStack_474 * fVar120;
            auVar50._16_4_ = fStack_470 * fVar121;
            auVar50._20_4_ = fStack_46c * fVar122;
            auVar50._24_4_ = fStack_468 * fVar123;
            auVar50._28_4_ = auVar205._28_4_;
            auVar51._4_4_ = fStack_65c * fVar147;
            auVar51._0_4_ = local_660 * fVar148;
            auVar51._8_4_ = fStack_658 * fVar119;
            auVar51._12_4_ = fStack_654 * fVar120;
            auVar51._16_4_ = fStack_650 * fVar121;
            auVar51._20_4_ = fStack_64c * fVar122;
            auVar51._24_4_ = fStack_648 * fVar123;
            auVar51._28_4_ = local_560._28_4_;
            auVar52._4_4_ = fVar147 * (float)local_640._4_4_;
            auVar52._0_4_ = fVar148 * (float)local_640._0_4_;
            auVar52._8_4_ = fVar119 * fStack_638;
            auVar52._12_4_ = fVar120 * fStack_634;
            auVar52._16_4_ = fVar121 * fStack_630;
            auVar52._20_4_ = fVar122 * fStack_62c;
            auVar52._24_4_ = fVar123 * fStack_628;
            auVar52._28_4_ = pfVar6[7];
            auVar115 = *(undefined1 (*) [32])(lVar23 + 0x21b72a4 + lVar98 * 4);
            auVar160 = vfmadd231ps_fma(auVar50,auVar115,local_680);
            auVar170 = vfmadd231ps_fma(auVar51,auVar115,local_5c0);
            auVar101 = vfmadd231ps_fma(auVar52,auVar115,local_620);
            auVar115 = *(undefined1 (*) [32])(lVar23 + 0x21b6e20 + lVar98 * 4);
            auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar115,local_760);
            auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar115,local_4c0);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar115,local_6c0);
            auVar115 = *(undefined1 (*) [32])(lVar23 + 0x21b699c + lVar98 * 4);
            auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar115,local_780);
            auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar115,local_4a0);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),local_560,auVar115);
            auVar204._8_4_ = 0x7fffffff;
            auVar204._0_8_ = 0x7fffffff7fffffff;
            auVar204._12_4_ = 0x7fffffff;
            auVar204._16_4_ = 0x7fffffff;
            auVar204._20_4_ = 0x7fffffff;
            auVar204._24_4_ = 0x7fffffff;
            auVar204._28_4_ = 0x7fffffff;
            auVar115 = vandps_avx(ZEXT1632(auVar127),auVar204);
            auVar107 = vandps_avx(ZEXT1632(auVar102),auVar204);
            auVar107 = vmaxps_avx(auVar115,auVar107);
            auVar115 = vandps_avx(ZEXT1632(auVar128),auVar204);
            auVar115 = vmaxps_avx(auVar107,auVar115);
            auVar90._4_4_ = fStack_11c;
            auVar90._0_4_ = local_120;
            auVar90._8_4_ = fStack_118;
            auVar90._12_4_ = fStack_114;
            auVar90._16_4_ = fStack_110;
            auVar90._20_4_ = fStack_10c;
            auVar90._24_4_ = fStack_108;
            auVar90._28_4_ = fStack_104;
            auVar115 = vcmpps_avx(auVar115,auVar90,1);
            auVar185 = vblendvps_avx(ZEXT1632(auVar127),auVar205,auVar115);
            auVar114 = vblendvps_avx(ZEXT1632(auVar102),_local_4e0,auVar115);
            auVar115 = vandps_avx(ZEXT1632(auVar160),auVar204);
            auVar107 = vandps_avx(ZEXT1632(auVar170),auVar204);
            auVar107 = vmaxps_avx(auVar115,auVar107);
            auVar115 = vandps_avx(auVar204,ZEXT1632(auVar101));
            auVar115 = vmaxps_avx(auVar107,auVar115);
            auVar107 = vcmpps_avx(auVar115,auVar90,1);
            auVar115 = vblendvps_avx(ZEXT1632(auVar160),auVar205,auVar107);
            auVar107 = vblendvps_avx(ZEXT1632(auVar170),_local_4e0,auVar107);
            auVar106 = vfmadd213ps_fma(auVar141,local_560,ZEXT1632(auVar106));
            auVar127 = vfmadd213ps_fma(auVar185,auVar185,ZEXT832(0) << 0x20);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar114,auVar114);
            auVar141 = vrsqrtps_avx(ZEXT1632(auVar127));
            fVar148 = auVar141._0_4_;
            fVar147 = auVar141._4_4_;
            fVar119 = auVar141._8_4_;
            fVar120 = auVar141._12_4_;
            fVar121 = auVar141._16_4_;
            fVar122 = auVar141._20_4_;
            fVar123 = auVar141._24_4_;
            auVar53._4_4_ = fVar147 * fVar147 * fVar147 * auVar127._4_4_ * -0.5;
            auVar53._0_4_ = fVar148 * fVar148 * fVar148 * auVar127._0_4_ * -0.5;
            auVar53._8_4_ = fVar119 * fVar119 * fVar119 * auVar127._8_4_ * -0.5;
            auVar53._12_4_ = fVar120 * fVar120 * fVar120 * auVar127._12_4_ * -0.5;
            auVar53._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
            auVar53._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar53._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar53._28_4_ = 0;
            auVar228._8_4_ = 0x3fc00000;
            auVar228._0_8_ = 0x3fc000003fc00000;
            auVar228._12_4_ = 0x3fc00000;
            auVar228._16_4_ = 0x3fc00000;
            auVar228._20_4_ = 0x3fc00000;
            auVar228._24_4_ = 0x3fc00000;
            auVar228._28_4_ = 0x3fc00000;
            auVar127 = vfmadd231ps_fma(auVar53,auVar228,auVar141);
            fVar148 = auVar127._0_4_;
            fVar147 = auVar127._4_4_;
            auVar54._4_4_ = auVar114._4_4_ * fVar147;
            auVar54._0_4_ = auVar114._0_4_ * fVar148;
            fVar119 = auVar127._8_4_;
            auVar54._8_4_ = auVar114._8_4_ * fVar119;
            fVar120 = auVar127._12_4_;
            auVar54._12_4_ = auVar114._12_4_ * fVar120;
            auVar54._16_4_ = auVar114._16_4_ * 0.0;
            auVar54._20_4_ = auVar114._20_4_ * 0.0;
            auVar54._24_4_ = auVar114._24_4_ * 0.0;
            auVar54._28_4_ = auVar141._28_4_;
            auVar55._4_4_ = fVar147 * -auVar185._4_4_;
            auVar55._0_4_ = fVar148 * -auVar185._0_4_;
            auVar55._8_4_ = fVar119 * -auVar185._8_4_;
            auVar55._12_4_ = fVar120 * -auVar185._12_4_;
            auVar55._16_4_ = -auVar185._16_4_ * 0.0;
            auVar55._20_4_ = -auVar185._20_4_ * 0.0;
            auVar55._24_4_ = -auVar185._24_4_ * 0.0;
            auVar55._28_4_ = auVar114._28_4_;
            auVar127 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar107,auVar107);
            auVar141 = vrsqrtps_avx(ZEXT1632(auVar127));
            auVar56._28_4_ = fStack_464;
            auVar56._0_28_ =
                 ZEXT1628(CONCAT412(fVar120 * 0.0,
                                    CONCAT48(fVar119 * 0.0,CONCAT44(fVar147 * 0.0,fVar148 * 0.0))));
            fVar148 = auVar141._0_4_;
            fVar147 = auVar141._4_4_;
            fVar119 = auVar141._8_4_;
            fVar120 = auVar141._12_4_;
            fVar121 = auVar141._16_4_;
            fVar122 = auVar141._20_4_;
            fVar123 = auVar141._24_4_;
            auVar57._4_4_ = fVar147 * fVar147 * fVar147 * auVar127._4_4_ * -0.5;
            auVar57._0_4_ = fVar148 * fVar148 * fVar148 * auVar127._0_4_ * -0.5;
            auVar57._8_4_ = fVar119 * fVar119 * fVar119 * auVar127._8_4_ * -0.5;
            auVar57._12_4_ = fVar120 * fVar120 * fVar120 * auVar127._12_4_ * -0.5;
            auVar57._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
            auVar57._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar57._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar57._28_4_ = 0;
            auVar127 = vfmadd231ps_fma(auVar57,auVar228,auVar141);
            fVar148 = auVar127._0_4_;
            auVar222._0_4_ = auVar107._0_4_ * fVar148;
            fVar147 = auVar127._4_4_;
            auVar222._4_4_ = auVar107._4_4_ * fVar147;
            fVar119 = auVar127._8_4_;
            auVar222._8_4_ = auVar107._8_4_ * fVar119;
            fVar120 = auVar127._12_4_;
            auVar222._12_4_ = auVar107._12_4_ * fVar120;
            auVar222._16_4_ = auVar107._16_4_ * 0.0;
            auVar222._20_4_ = auVar107._20_4_ * 0.0;
            auVar222._24_4_ = auVar107._24_4_ * 0.0;
            auVar222._28_4_ = 0;
            auVar58._4_4_ = fVar147 * -auVar115._4_4_;
            auVar58._0_4_ = fVar148 * -auVar115._0_4_;
            auVar58._8_4_ = fVar119 * -auVar115._8_4_;
            auVar58._12_4_ = fVar120 * -auVar115._12_4_;
            auVar58._16_4_ = -auVar115._16_4_ * 0.0;
            auVar58._20_4_ = -auVar115._20_4_ * 0.0;
            auVar58._24_4_ = -auVar115._24_4_ * 0.0;
            auVar58._28_4_ = auVar141._28_4_;
            auVar59._28_4_ = 0xbf000000;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar120 * 0.0,
                                    CONCAT48(fVar119 * 0.0,CONCAT44(fVar147 * 0.0,fVar148 * 0.0))));
            auVar127 = vfmadd213ps_fma(auVar54,auVar116,local_340);
            auVar102 = vfmadd213ps_fma(auVar55,auVar116,local_320);
            auVar128 = vfmadd213ps_fma(auVar56,auVar116,ZEXT1632(auVar106));
            auVar126 = vfnmadd213ps_fma(auVar54,auVar116,local_340);
            auVar160 = vfmadd213ps_fma(auVar222,ZEXT1632(auVar17),local_600);
            auVar169 = vfnmadd213ps_fma(auVar55,auVar116,local_320);
            auVar141 = ZEXT1632(auVar17);
            auVar170 = vfmadd213ps_fma(auVar58,auVar141,local_5e0);
            auVar180 = vfnmadd231ps_fma(ZEXT1632(auVar106),auVar116,auVar56);
            auVar106 = vfmadd213ps_fma(auVar59,auVar141,ZEXT1632(auVar165));
            auVar178 = vfnmadd213ps_fma(auVar222,auVar141,local_600);
            auVar179 = vfnmadd213ps_fma(auVar58,auVar141,local_5e0);
            auVar165 = vfnmadd231ps_fma(ZEXT1632(auVar165),ZEXT1632(auVar17),auVar59);
            local_6e0 = ZEXT1632(auVar165);
            auVar141 = vsubps_avx(ZEXT1632(auVar170),ZEXT1632(auVar169));
            auVar115 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar180));
            auVar60._4_4_ = auVar141._4_4_ * auVar180._4_4_;
            auVar60._0_4_ = auVar141._0_4_ * auVar180._0_4_;
            auVar60._8_4_ = auVar141._8_4_ * auVar180._8_4_;
            auVar60._12_4_ = auVar141._12_4_ * auVar180._12_4_;
            auVar60._16_4_ = auVar141._16_4_ * 0.0;
            auVar60._20_4_ = auVar141._20_4_ * 0.0;
            auVar60._24_4_ = auVar141._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar169),auVar115);
            auVar61._4_4_ = auVar126._4_4_ * auVar115._4_4_;
            auVar61._0_4_ = auVar126._0_4_ * auVar115._0_4_;
            auVar61._8_4_ = auVar126._8_4_ * auVar115._8_4_;
            auVar61._12_4_ = auVar126._12_4_ * auVar115._12_4_;
            auVar61._16_4_ = auVar115._16_4_ * 0.0;
            auVar61._20_4_ = auVar115._20_4_ * 0.0;
            auVar61._24_4_ = auVar115._24_4_ * 0.0;
            auVar61._28_4_ = auVar115._28_4_;
            auVar205 = ZEXT1632(auVar126);
            auVar115 = vsubps_avx(ZEXT1632(auVar160),auVar205);
            auVar109 = ZEXT1632(auVar180);
            auVar165 = vfmsub231ps_fma(auVar61,auVar109,auVar115);
            auVar62._4_4_ = auVar169._4_4_ * auVar115._4_4_;
            auVar62._0_4_ = auVar169._0_4_ * auVar115._0_4_;
            auVar62._8_4_ = auVar169._8_4_ * auVar115._8_4_;
            auVar62._12_4_ = auVar169._12_4_ * auVar115._12_4_;
            auVar62._16_4_ = auVar115._16_4_ * 0.0;
            auVar62._20_4_ = auVar115._20_4_ * 0.0;
            auVar62._24_4_ = auVar115._24_4_ * 0.0;
            auVar62._28_4_ = auVar115._28_4_;
            auVar126 = vfmsub231ps_fma(auVar62,auVar205,auVar141);
            auVar141 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar141,ZEXT1632(auVar165));
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar141,ZEXT1632(auVar101));
            auVar16 = vcmpps_avx(ZEXT1632(auVar165),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar141 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar127),auVar16);
            auVar115 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar102),auVar16);
            auVar107 = vblendvps_avx(local_6e0,ZEXT1632(auVar128),auVar16);
            auVar219 = ZEXT3264(auVar107);
            auVar185 = vblendvps_avx(auVar205,ZEXT1632(auVar160),auVar16);
            auVar114 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar170),auVar16);
            auVar138 = vblendvps_avx(auVar109,ZEXT1632(auVar106),auVar16);
            auVar205 = vblendvps_avx(ZEXT1632(auVar160),auVar205,auVar16);
            auVar118 = vblendvps_avx(ZEXT1632(auVar170),ZEXT1632(auVar169),auVar16);
            auVar165 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
            auVar109 = vblendvps_avx(ZEXT1632(auVar106),auVar109,auVar16);
            auVar205 = vsubps_avx(auVar205,auVar141);
            auVar118 = vsubps_avx(auVar118,auVar115);
            auVar21 = vsubps_avx(auVar109,auVar107);
            auVar108 = vsubps_avx(auVar141,auVar185);
            auVar110 = vsubps_avx(auVar115,auVar114);
            auVar133 = vsubps_avx(auVar107,auVar138);
            auVar182._0_4_ = auVar21._0_4_ * auVar141._0_4_;
            auVar182._4_4_ = auVar21._4_4_ * auVar141._4_4_;
            auVar182._8_4_ = auVar21._8_4_ * auVar141._8_4_;
            auVar182._12_4_ = auVar21._12_4_ * auVar141._12_4_;
            auVar182._16_4_ = auVar21._16_4_ * auVar141._16_4_;
            auVar182._20_4_ = auVar21._20_4_ * auVar141._20_4_;
            auVar182._24_4_ = auVar21._24_4_ * auVar141._24_4_;
            auVar182._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar182,auVar107,auVar205);
            auVar63._4_4_ = auVar205._4_4_ * auVar115._4_4_;
            auVar63._0_4_ = auVar205._0_4_ * auVar115._0_4_;
            auVar63._8_4_ = auVar205._8_4_ * auVar115._8_4_;
            auVar63._12_4_ = auVar205._12_4_ * auVar115._12_4_;
            auVar63._16_4_ = auVar205._16_4_ * auVar115._16_4_;
            auVar63._20_4_ = auVar205._20_4_ * auVar115._20_4_;
            auVar63._24_4_ = auVar205._24_4_ * auVar115._24_4_;
            auVar63._28_4_ = auVar109._28_4_;
            auVar127 = vfmsub231ps_fma(auVar63,auVar141,auVar118);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar127),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar183._0_4_ = auVar107._0_4_ * auVar118._0_4_;
            auVar183._4_4_ = auVar107._4_4_ * auVar118._4_4_;
            auVar183._8_4_ = auVar107._8_4_ * auVar118._8_4_;
            auVar183._12_4_ = auVar107._12_4_ * auVar118._12_4_;
            auVar183._16_4_ = auVar107._16_4_ * auVar118._16_4_;
            auVar183._20_4_ = auVar107._20_4_ * auVar118._20_4_;
            auVar183._24_4_ = auVar107._24_4_ * auVar118._24_4_;
            auVar183._28_4_ = 0;
            auVar127 = vfmsub231ps_fma(auVar183,auVar115,auVar21);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar127));
            auVar184._0_4_ = auVar133._0_4_ * auVar185._0_4_;
            auVar184._4_4_ = auVar133._4_4_ * auVar185._4_4_;
            auVar184._8_4_ = auVar133._8_4_ * auVar185._8_4_;
            auVar184._12_4_ = auVar133._12_4_ * auVar185._12_4_;
            auVar184._16_4_ = auVar133._16_4_ * auVar185._16_4_;
            auVar184._20_4_ = auVar133._20_4_ * auVar185._20_4_;
            auVar184._24_4_ = auVar133._24_4_ * auVar185._24_4_;
            auVar184._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar184,auVar108,auVar138);
            auVar64._4_4_ = auVar110._4_4_ * auVar138._4_4_;
            auVar64._0_4_ = auVar110._0_4_ * auVar138._0_4_;
            auVar64._8_4_ = auVar110._8_4_ * auVar138._8_4_;
            auVar64._12_4_ = auVar110._12_4_ * auVar138._12_4_;
            auVar64._16_4_ = auVar110._16_4_ * auVar138._16_4_;
            auVar64._20_4_ = auVar110._20_4_ * auVar138._20_4_;
            auVar64._24_4_ = auVar110._24_4_ * auVar138._24_4_;
            auVar64._28_4_ = auVar138._28_4_;
            auVar102 = vfmsub231ps_fma(auVar64,auVar114,auVar133);
            auVar65._4_4_ = auVar108._4_4_ * auVar114._4_4_;
            auVar65._0_4_ = auVar108._0_4_ * auVar114._0_4_;
            auVar65._8_4_ = auVar108._8_4_ * auVar114._8_4_;
            auVar65._12_4_ = auVar108._12_4_ * auVar114._12_4_;
            auVar65._16_4_ = auVar108._16_4_ * auVar114._16_4_;
            auVar65._20_4_ = auVar108._20_4_ * auVar114._20_4_;
            auVar65._24_4_ = auVar108._24_4_ * auVar114._24_4_;
            auVar65._28_4_ = auVar114._28_4_;
            auVar128 = vfmsub231ps_fma(auVar65,auVar110,auVar185);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar128),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
            auVar185 = vmaxps_avx(ZEXT1632(auVar127),ZEXT1632(auVar102));
            auVar185 = vcmpps_avx(auVar185,ZEXT832(0) << 0x20,2);
            auVar106 = vpackssdw_avx(auVar185._0_16_,auVar185._16_16_);
            auVar165 = vpand_avx(auVar106,auVar165);
            auVar185 = vpmovsxwd_avx2(auVar165);
            if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar185 >> 0x7f,0) == '\0') &&
                  (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar185 >> 0xbf,0) == '\0') &&
                (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar185[0x1f]) {
LAB_01619448:
              auVar167._8_8_ = local_5a0[1]._8_8_;
              auVar167._0_8_ = local_5a0[1]._0_8_;
              auVar167._16_8_ = local_5a0[1]._16_8_;
              auVar167._24_8_ = local_5a0[1]._24_8_;
            }
            else {
              auVar66._4_4_ = auVar133._4_4_ * auVar118._4_4_;
              auVar66._0_4_ = auVar133._0_4_ * auVar118._0_4_;
              auVar66._8_4_ = auVar133._8_4_ * auVar118._8_4_;
              auVar66._12_4_ = auVar133._12_4_ * auVar118._12_4_;
              auVar66._16_4_ = auVar133._16_4_ * auVar118._16_4_;
              auVar66._20_4_ = auVar133._20_4_ * auVar118._20_4_;
              auVar66._24_4_ = auVar133._24_4_ * auVar118._24_4_;
              auVar66._28_4_ = auVar185._28_4_;
              auVar170 = vfmsub231ps_fma(auVar66,auVar110,auVar21);
              auVar190._0_4_ = auVar21._0_4_ * auVar108._0_4_;
              auVar190._4_4_ = auVar21._4_4_ * auVar108._4_4_;
              auVar190._8_4_ = auVar21._8_4_ * auVar108._8_4_;
              auVar190._12_4_ = auVar21._12_4_ * auVar108._12_4_;
              auVar190._16_4_ = auVar21._16_4_ * auVar108._16_4_;
              auVar190._20_4_ = auVar21._20_4_ * auVar108._20_4_;
              auVar190._24_4_ = auVar21._24_4_ * auVar108._24_4_;
              auVar190._28_4_ = 0;
              auVar160 = vfmsub231ps_fma(auVar190,auVar205,auVar133);
              auVar67._4_4_ = auVar205._4_4_ * auVar110._4_4_;
              auVar67._0_4_ = auVar205._0_4_ * auVar110._0_4_;
              auVar67._8_4_ = auVar205._8_4_ * auVar110._8_4_;
              auVar67._12_4_ = auVar205._12_4_ * auVar110._12_4_;
              auVar67._16_4_ = auVar205._16_4_ * auVar110._16_4_;
              auVar67._20_4_ = auVar205._20_4_ * auVar110._20_4_;
              auVar67._24_4_ = auVar205._24_4_ * auVar110._24_4_;
              auVar67._28_4_ = auVar110._28_4_;
              auVar101 = vfmsub231ps_fma(auVar67,auVar108,auVar118);
              auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar160),ZEXT1632(auVar101));
              auVar128 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar170),ZEXT832(0) << 0x20);
              auVar185 = vrcpps_avx(ZEXT1632(auVar128));
              auVar218._8_4_ = 0x3f800000;
              auVar218._0_8_ = 0x3f8000003f800000;
              auVar218._12_4_ = 0x3f800000;
              auVar218._16_4_ = 0x3f800000;
              auVar218._20_4_ = 0x3f800000;
              auVar218._24_4_ = 0x3f800000;
              auVar218._28_4_ = 0x3f800000;
              auVar219 = ZEXT3264(auVar218);
              auVar106 = vfnmadd213ps_fma(auVar185,ZEXT1632(auVar128),auVar218);
              auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar185,auVar185);
              auVar68._4_4_ = auVar101._4_4_ * auVar107._4_4_;
              auVar68._0_4_ = auVar101._0_4_ * auVar107._0_4_;
              auVar68._8_4_ = auVar101._8_4_ * auVar107._8_4_;
              auVar68._12_4_ = auVar101._12_4_ * auVar107._12_4_;
              auVar68._16_4_ = auVar107._16_4_ * 0.0;
              auVar68._20_4_ = auVar107._20_4_ * 0.0;
              auVar68._24_4_ = auVar107._24_4_ * 0.0;
              auVar68._28_4_ = auVar118._28_4_;
              auVar160 = vfmadd231ps_fma(auVar68,auVar115,ZEXT1632(auVar160));
              auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),ZEXT1632(auVar170),auVar141);
              fVar148 = auVar106._0_4_;
              fVar147 = auVar106._4_4_;
              fVar119 = auVar106._8_4_;
              fVar120 = auVar106._12_4_;
              auVar185 = ZEXT1632(CONCAT412(fVar120 * auVar160._12_4_,
                                            CONCAT48(fVar119 * auVar160._8_4_,
                                                     CONCAT44(fVar147 * auVar160._4_4_,
                                                              fVar148 * auVar160._0_4_))));
              uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar166._4_4_ = uVar99;
              auVar166._0_4_ = uVar99;
              auVar166._8_4_ = uVar99;
              auVar166._12_4_ = uVar99;
              auVar166._16_4_ = uVar99;
              auVar166._20_4_ = uVar99;
              auVar166._24_4_ = uVar99;
              auVar166._28_4_ = uVar99;
              auVar89._4_4_ = uStack_13c;
              auVar89._0_4_ = local_140;
              auVar89._8_4_ = uStack_138;
              auVar89._12_4_ = uStack_134;
              auVar89._16_4_ = uStack_130;
              auVar89._20_4_ = uStack_12c;
              auVar89._24_4_ = uStack_128;
              auVar89._28_4_ = uStack_124;
              auVar141 = vcmpps_avx(auVar89,auVar185,2);
              auVar115 = vcmpps_avx(auVar185,auVar166,2);
              auVar141 = vandps_avx(auVar115,auVar141);
              auVar106 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
              auVar165 = vpand_avx(auVar165,auVar106);
              auVar141 = vpmovsxwd_avx2(auVar165);
              if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar141 >> 0x7f,0) == '\0') &&
                    (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar141 >> 0xbf,0) == '\0') &&
                  (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar141[0x1f]) goto LAB_01619448;
              auVar141 = vcmpps_avx(ZEXT1632(auVar128),ZEXT832(0) << 0x20,4);
              auVar106 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
              auVar165 = vpand_avx(auVar165,auVar106);
              auVar141 = vpmovsxwd_avx2(auVar165);
              auVar167._8_8_ = local_5a0[1]._8_8_;
              auVar167._0_8_ = local_5a0[1]._0_8_;
              auVar167._16_8_ = local_5a0[1]._16_8_;
              auVar167._24_8_ = local_5a0[1]._24_8_;
              if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar141 >> 0x7f,0) != '\0') ||
                    (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar141 >> 0xbf,0) != '\0') ||
                  (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar141[0x1f] < '\0') {
                auVar114 = ZEXT1632(CONCAT412(fVar120 * auVar127._12_4_,
                                              CONCAT48(fVar119 * auVar127._8_4_,
                                                       CONCAT44(fVar147 * auVar127._4_4_,
                                                                fVar148 * auVar127._0_4_))));
                auVar69._28_4_ = SUB84(local_5a0[1]._24_8_,4);
                auVar69._0_28_ =
                     ZEXT1628(CONCAT412(fVar120 * auVar102._12_4_,
                                        CONCAT48(fVar119 * auVar102._8_4_,
                                                 CONCAT44(fVar147 * auVar102._4_4_,
                                                          fVar148 * auVar102._0_4_))));
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = 0x3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar198._16_4_ = 0x3f800000;
                auVar198._20_4_ = 0x3f800000;
                auVar198._24_4_ = 0x3f800000;
                auVar198._28_4_ = 0x3f800000;
                auVar115 = vsubps_avx(auVar198,auVar114);
                local_100 = vblendvps_avx(auVar115,auVar114,auVar16);
                auVar115 = vsubps_avx(auVar198,auVar69);
                local_3c0 = vblendvps_avx(auVar115,auVar69,auVar16);
                auVar167 = auVar141;
                local_540 = auVar185;
              }
            }
            auVar229 = ZEXT3264(local_780);
            auVar223 = ZEXT3264(local_760);
            auVar199 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            local_500 = auVar116;
            if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar167 >> 0x7f,0) != '\0') ||
                  (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar167 >> 0xbf,0) != '\0') ||
                (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar167[0x1f] < '\0') {
              auVar141 = vsubps_avx(ZEXT1632(auVar17),auVar116);
              auVar165 = vfmadd213ps_fma(auVar141,local_100,auVar116);
              fVar148 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar70._4_4_ = (auVar165._4_4_ + auVar165._4_4_) * fVar148;
              auVar70._0_4_ = (auVar165._0_4_ + auVar165._0_4_) * fVar148;
              auVar70._8_4_ = (auVar165._8_4_ + auVar165._8_4_) * fVar148;
              auVar70._12_4_ = (auVar165._12_4_ + auVar165._12_4_) * fVar148;
              auVar70._16_4_ = fVar148 * 0.0;
              auVar70._20_4_ = fVar148 * 0.0;
              auVar70._24_4_ = fVar148 * 0.0;
              auVar70._28_4_ = fVar148;
              auVar141 = vcmpps_avx(local_540,auVar70,6);
              auVar115 = auVar167 & auVar141;
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0x7f,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0xbf,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar115[0x1f] < '\0') {
                auVar142._8_4_ = 0xbf800000;
                auVar142._0_8_ = 0xbf800000bf800000;
                auVar142._12_4_ = 0xbf800000;
                auVar142._16_4_ = 0xbf800000;
                auVar142._20_4_ = 0xbf800000;
                auVar142._24_4_ = 0xbf800000;
                auVar142._28_4_ = 0xbf800000;
                auVar159._8_4_ = 0x40000000;
                auVar159._0_8_ = 0x4000000040000000;
                auVar159._12_4_ = 0x40000000;
                auVar159._16_4_ = 0x40000000;
                auVar159._20_4_ = 0x40000000;
                auVar159._24_4_ = 0x40000000;
                auVar159._28_4_ = 0x40000000;
                auVar165 = vfmadd213ps_fma(local_3c0,auVar159,auVar142);
                local_2c0 = local_100;
                local_3c0 = ZEXT1632(auVar165);
                auVar115 = local_3c0;
                local_2a0 = ZEXT1632(auVar165);
                local_280 = local_540;
                local_25c = iVar12;
                local_250 = uVar79;
                uStack_248 = uVar80;
                local_240 = uVar81;
                uStack_238 = uVar82;
                local_230 = uVar83;
                uStack_228 = uVar84;
                local_220 = uVar85;
                uStack_218 = uVar86;
                pGVar14 = (context->scene->geometries).items[uVar92].ptr;
                local_3c0 = auVar115;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5a0[0] = vandps_avx(auVar141,auVar167);
                  fVar148 = (float)local_260;
                  local_1e0[0] = (fVar148 + local_100._0_4_ + 0.0) * local_160;
                  local_1e0[1] = (fVar148 + local_100._4_4_ + 1.0) * fStack_15c;
                  local_1e0[2] = (fVar148 + local_100._8_4_ + 2.0) * fStack_158;
                  local_1e0[3] = (fVar148 + local_100._12_4_ + 3.0) * fStack_154;
                  fStack_1d0 = (fVar148 + local_100._16_4_ + 4.0) * fStack_150;
                  fStack_1cc = (fVar148 + local_100._20_4_ + 5.0) * fStack_14c;
                  fStack_1c8 = (fVar148 + local_100._24_4_ + 6.0) * fStack_148;
                  fStack_1c4 = fVar148 + local_100._28_4_ + 7.0;
                  local_3c0._0_8_ = auVar165._0_8_;
                  local_3c0._8_8_ = auVar165._8_8_;
                  local_1c0 = local_3c0._0_8_;
                  uStack_1b8 = local_3c0._8_8_;
                  uStack_1b0 = 0;
                  uStack_1a8 = 0;
                  local_1a0 = local_540;
                  auVar143._8_4_ = 0x7f800000;
                  auVar143._0_8_ = 0x7f8000007f800000;
                  auVar143._12_4_ = 0x7f800000;
                  auVar143._16_4_ = 0x7f800000;
                  auVar143._20_4_ = 0x7f800000;
                  auVar143._24_4_ = 0x7f800000;
                  auVar143._28_4_ = 0x7f800000;
                  auVar141 = vblendvps_avx(auVar143,local_540,local_5a0[0]);
                  auVar115 = vshufps_avx(auVar141,auVar141,0xb1);
                  auVar115 = vminps_avx(auVar141,auVar115);
                  auVar185 = vshufpd_avx(auVar115,auVar115,5);
                  auVar115 = vminps_avx(auVar115,auVar185);
                  auVar185 = vpermpd_avx2(auVar115,0x4e);
                  auVar115 = vminps_avx(auVar115,auVar185);
                  auVar115 = vcmpps_avx(auVar141,auVar115,0);
                  auVar185 = local_5a0[0] & auVar115;
                  auVar141 = local_5a0[0];
                  if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar185 >> 0x7f,0) != '\0') ||
                        (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar185 >> 0xbf,0) != '\0') ||
                      (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar185[0x1f] < '\0') {
                    auVar141 = vandps_avx(auVar115,local_5a0[0]);
                  }
                  uVar93 = vmovmskps_avx(auVar141);
                  uVar22 = 0;
                  for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                    uVar22 = uVar22 + 1;
                  }
                  uVar94 = (ulong)uVar22;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar148 = local_1e0[uVar94];
                    fVar147 = 1.0 - fVar148;
                    auVar106 = ZEXT416((uint)fVar148);
                    auVar165 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar106,
                                               ZEXT416(0xc0a00000));
                    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * 3.0)),
                                              ZEXT416((uint)(fVar148 + fVar148)),auVar165);
                    auVar165 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar106,
                                               ZEXT416(0x40000000));
                    auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                               ZEXT416((uint)(fVar147 + fVar147)),auVar165);
                    auVar127 = vfnmadd231ss_fma(ZEXT416((uint)(fVar148 * (fVar147 + fVar147))),
                                                ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                    auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148)),auVar106,
                                               ZEXT416((uint)(fVar147 * -2.0)));
                    fVar147 = auVar165._0_4_ * 0.5;
                    fVar119 = auVar106._0_4_ * 0.5;
                    auVar163._0_4_ = fVar119 * local_820;
                    auVar163._4_4_ = fVar119 * fStack_81c;
                    auVar163._8_4_ = fVar119 * fStack_818;
                    auVar163._12_4_ = fVar119 * fStack_814;
                    auVar130._4_4_ = fVar147;
                    auVar130._0_4_ = fVar147;
                    auVar130._8_4_ = fVar147;
                    auVar130._12_4_ = fVar147;
                    auVar165 = vfmadd132ps_fma(auVar130,auVar163,auVar18);
                    fVar147 = auVar17._0_4_ * 0.5;
                    auVar164._4_4_ = fVar147;
                    auVar164._0_4_ = fVar147;
                    auVar164._8_4_ = fVar147;
                    auVar164._12_4_ = fVar147;
                    auVar165 = vfmadd132ps_fma(auVar164,auVar165,auVar19);
                    uVar99 = *(undefined4 *)((long)&local_1c0 + uVar94 * 4);
                    fVar147 = auVar127._0_4_ * 0.5;
                    auVar151._4_4_ = fVar147;
                    auVar151._0_4_ = fVar147;
                    auVar151._8_4_ = fVar147;
                    auVar151._12_4_ = fVar147;
                    auVar165 = vfmadd132ps_fma(auVar151,auVar165,auVar20);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar94 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
                    uVar211 = vextractps_avx(auVar165,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar211;
                    uVar211 = vextractps_avx(auVar165,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar211;
                    *(float *)(ray + k * 4 + 0xf0) = fVar148;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar99;
                    *(uint *)(ray + k * 4 + 0x110) = uVar11;
                    *(uint *)(ray + k * 4 + 0x120) = uVar92;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_700._16_16_ = auVar9._16_16_;
                    local_700._0_16_ = *local_690;
                    _auStack_7d0 = auVar107._16_16_;
                    _local_7e0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    local_698 = context;
                    while( true ) {
                      auVar141 = _local_7e0;
                      fVar148 = local_1e0[uVar94];
                      local_420._4_4_ = fVar148;
                      local_420._0_4_ = fVar148;
                      local_420._8_4_ = fVar148;
                      local_420._12_4_ = fVar148;
                      local_410 = *(undefined4 *)((long)&local_1c0 + uVar94 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar94 * 4);
                      fVar147 = 1.0 - fVar148;
                      auVar165 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                                 ZEXT416(0xc0a00000));
                      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * 3.0)),
                                                ZEXT416((uint)(fVar148 + fVar148)),auVar165);
                      auVar165 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                                 ZEXT416(0x40000000));
                      auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                                 ZEXT416((uint)(fVar147 + fVar147)),auVar165);
                      auVar127 = vfnmadd231ss_fma(ZEXT416((uint)(fVar148 * (fVar147 + fVar147))),
                                                  ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                      auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148)),local_420,
                                                 ZEXT416((uint)(fVar147 * -2.0)));
                      fVar148 = auVar165._0_4_ * 0.5;
                      fVar147 = auVar106._0_4_ * 0.5;
                      auVar172._0_4_ = fVar147 * local_820;
                      auVar172._4_4_ = fVar147 * fStack_81c;
                      auVar172._8_4_ = fVar147 * fStack_818;
                      auVar172._12_4_ = fVar147 * fStack_814;
                      auVar152._4_4_ = fVar148;
                      auVar152._0_4_ = fVar148;
                      auVar152._8_4_ = fVar148;
                      auVar152._12_4_ = fVar148;
                      auVar165 = vfmadd132ps_fma(auVar152,auVar172,auVar104);
                      fVar148 = auVar17._0_4_ * 0.5;
                      auVar173._4_4_ = fVar148;
                      auVar173._0_4_ = fVar148;
                      auVar173._8_4_ = fVar148;
                      auVar173._12_4_ = fVar148;
                      auVar165 = vfmadd132ps_fma(auVar173,auVar165,auVar103);
                      local_730.context = context->user;
                      fVar148 = auVar127._0_4_ * 0.5;
                      auVar153._4_4_ = fVar148;
                      auVar153._0_4_ = fVar148;
                      auVar153._8_4_ = fVar148;
                      auVar153._12_4_ = fVar148;
                      auVar17 = vfmadd132ps_fma(auVar153,auVar165,auVar149);
                      local_450 = auVar17._0_4_;
                      uStack_44c = local_450;
                      uStack_448 = local_450;
                      uStack_444 = local_450;
                      auVar165 = vshufps_avx(auVar17,auVar17,0x55);
                      local_440 = auVar165;
                      local_430 = vshufps_avx(auVar17,auVar17,0xaa);
                      uStack_40c = local_410;
                      uStack_408 = local_410;
                      uStack_404 = local_410;
                      local_400 = CONCAT44(uStack_2fc,local_300);
                      uStack_3f8 = CONCAT44(uStack_2f4,uStack_2f8);
                      local_3f0._4_4_ = uStack_2ec;
                      local_3f0._0_4_ = local_2f0;
                      local_3f0._8_4_ = uStack_2e8;
                      local_3f0._12_4_ = uStack_2e4;
                      vpcmpeqd_avx2(ZEXT1632(local_3f0),ZEXT1632(local_3f0));
                      uStack_3dc = (local_730.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_730.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_7b0 = local_700._0_16_;
                      local_730.valid = (int *)local_7b0;
                      local_730.geometryUserPtr = pGVar14->userPtr;
                      local_730.hit = (RTCHitN *)&local_450;
                      local_730.N = 4;
                      local_730.ray = (RTCRayN *)ray;
                      if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        (*pGVar14->intersectionFilterN)(&local_730);
                        context = local_698;
                      }
                      if (local_7b0 == (undefined1  [16])0x0) {
                        auVar165 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar165 = auVar165 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          (*p_Var15)(&local_730);
                          context = local_698;
                        }
                        auVar17 = vpcmpeqd_avx(local_7b0,_DAT_01f7aa10);
                        auVar106 = vpcmpeqd_avx(auVar165,auVar165);
                        auVar165 = auVar17 ^ auVar106;
                        if (local_7b0 != (undefined1  [16])0x0) {
                          auVar17 = auVar17 ^ auVar106;
                          auVar106 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])local_730.hit);
                          *(undefined1 (*) [16])(local_730.ray + 0xc0) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])
                                                             (local_730.hit + 0x10));
                          *(undefined1 (*) [16])(local_730.ray + 0xd0) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])
                                                             (local_730.hit + 0x20));
                          *(undefined1 (*) [16])(local_730.ray + 0xe0) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])
                                                             (local_730.hit + 0x30));
                          *(undefined1 (*) [16])(local_730.ray + 0xf0) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])
                                                             (local_730.hit + 0x40));
                          *(undefined1 (*) [16])(local_730.ray + 0x100) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])
                                                             (local_730.hit + 0x50));
                          *(undefined1 (*) [16])(local_730.ray + 0x110) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])
                                                             (local_730.hit + 0x60));
                          *(undefined1 (*) [16])(local_730.ray + 0x120) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])
                                                             (local_730.hit + 0x70));
                          *(undefined1 (*) [16])(local_730.ray + 0x130) = auVar106;
                          auVar17 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])
                                                            (local_730.hit + 0x80));
                          *(undefined1 (*) [16])(local_730.ray + 0x140) = auVar17;
                        }
                      }
                      auVar115 = local_540;
                      auVar131._8_8_ = 0x100000001;
                      auVar131._0_8_ = 0x100000001;
                      if ((auVar131 & auVar165) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_7e0._0_4_;
                      }
                      else {
                        local_7e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_7e0._4_4_ = 0;
                        fStack_7d8 = 0.0;
                        fStack_7d4 = 0.0;
                      }
                      *(undefined4 *)(local_5a0[0] + uVar94 * 4) = 0;
                      _auStack_7d0 = auVar141._16_16_;
                      auVar117._4_4_ = local_7e0._0_4_;
                      auVar117._0_4_ = local_7e0._0_4_;
                      auVar117._8_4_ = local_7e0._0_4_;
                      auVar117._12_4_ = local_7e0._0_4_;
                      auVar117._16_4_ = local_7e0._0_4_;
                      auVar117._20_4_ = local_7e0._0_4_;
                      auVar117._24_4_ = local_7e0._0_4_;
                      auVar117._28_4_ = local_7e0._0_4_;
                      auVar9 = vcmpps_avx(auVar115,auVar117,2);
                      auVar141 = vandps_avx(auVar9,local_5a0[0]);
                      local_5a0[0] = local_5a0[0] & auVar9;
                      if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) ==
                               (undefined1  [32])0x0) &&
                              (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) && SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                            (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                           && SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                          (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                          && -1 < local_5a0[0][0x1f]) break;
                      auVar144._8_4_ = 0x7f800000;
                      auVar144._0_8_ = 0x7f8000007f800000;
                      auVar144._12_4_ = 0x7f800000;
                      auVar144._16_4_ = 0x7f800000;
                      auVar144._20_4_ = 0x7f800000;
                      auVar144._24_4_ = 0x7f800000;
                      auVar144._28_4_ = 0x7f800000;
                      auVar115 = vblendvps_avx(auVar144,auVar115,auVar141);
                      auVar9 = vshufps_avx(auVar115,auVar115,0xb1);
                      auVar9 = vminps_avx(auVar115,auVar9);
                      auVar107 = vshufpd_avx(auVar9,auVar9,5);
                      auVar9 = vminps_avx(auVar9,auVar107);
                      auVar107 = vpermpd_avx2(auVar9,0x4e);
                      auVar9 = vminps_avx(auVar9,auVar107);
                      auVar9 = vcmpps_avx(auVar115,auVar9,0);
                      auVar107 = auVar141 & auVar9;
                      auVar115 = auVar141;
                      if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar107 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar107 >> 0x7f,0) != '\0') ||
                            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar107 >> 0xbf,0) != '\0') ||
                          (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar107[0x1f] < '\0') {
                        auVar115 = vandps_avx(auVar9,auVar141);
                      }
                      uVar93 = vmovmskps_avx(auVar115);
                      uVar22 = 0;
                      for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                        uVar22 = uVar22 + 1;
                      }
                      uVar94 = (ulong)uVar22;
                      local_5a0[0] = auVar141;
                    }
                    auVar199 = ZEXT3264(CONCAT428(fStack_644,
                                                  CONCAT424(fStack_648,
                                                            CONCAT420(fStack_64c,
                                                                      CONCAT416(fStack_650,
                                                                                CONCAT412(fStack_654
                                                                                          ,CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                    auVar223 = ZEXT3264(local_760);
                    auVar229 = ZEXT3264(local_780);
                    pre = local_790;
                    prim = local_788;
                    pLVar96 = local_798;
                  }
                }
              }
            }
          }
          auVar146 = ZEXT3264(local_680);
          lVar98 = lVar98 + 8;
          auVar168 = ZEXT3264(local_5c0);
        } while ((int)lVar98 < iVar12);
      }
      uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar105._4_4_ = uVar99;
      auVar105._0_4_ = uVar99;
      auVar105._8_4_ = uVar99;
      auVar105._12_4_ = uVar99;
      auVar165 = vcmpps_avx(local_2e0,auVar105,2);
      uVar92 = vmovmskps_avx(auVar165);
      uVar92 = (uint)uVar97 & uVar92;
    } while (uVar92 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }